

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::transpose_pack_A_tile_quantize
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t *psVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [64];
  ulong uVar14;
  uint uVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [64];
  uint uVar22;
  long lVar23;
  undefined1 (*pauVar24) [64];
  ulong uVar25;
  undefined1 (*pauVar26) [32];
  uint *puVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  __m128i _vindex;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar124 [16];
  undefined1 auVar133 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint local_60;
  uint local_48;
  
  puVar16 = &stack0xffffffffffffff58;
  puVar17 = &stack0xffffffffffffff58;
  iVar8 = cpu_support_x86_avx512_vnni();
  if (iVar8 != 0) {
    transpose_pack_A_tile_fp32_to_int8_avx512vnni(A,AT,i,max_ii,k,max_kk,scales);
    return;
  }
  iVar8 = cpu_support_x86_avx_vnni_int8();
  if (iVar8 == 0) {
    iVar8 = cpu_support_x86_avx_vnni();
    if (iVar8 == 0) {
      iVar8 = A->elempack;
      lVar28 = (long)iVar8;
      psVar11 = (size_t *)&A->w;
      if (A->dims == 3) {
        psVar11 = &A->cstep;
      }
      iVar4 = (int)*psVar11;
      pauVar13 = (undefined1 (*) [64])AT->data;
      uVar12 = 0;
      lVar29 = (long)i;
      lVar18 = (long)iVar4;
      if (0xf < max_ii) {
        local_60 = max_kk & 0xfffffffe;
        lVar19 = (long)(iVar4 * k) * 4 + lVar28 * lVar29 * 4;
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar47[8] = 0x81;
        auVar47._0_8_ = 0x8181818181818181;
        auVar47[9] = 0x81;
        auVar47[10] = 0x81;
        auVar47[0xb] = 0x81;
        auVar47[0xc] = 0x81;
        auVar47[0xd] = 0x81;
        auVar47[0xe] = 0x81;
        auVar47[0xf] = 0x81;
        auVar63 = vpmovsxbw_avx512bw(_DAT_005b2560);
        auVar64 = vpmovsxbw_avx512bw(_DAT_005b2580);
        auVar65 = vpmovsxbd_avx512f(_DAT_005b25d0);
        auVar66 = vpmovsxbd_avx512f(_DAT_005b25e0);
        uVar25 = 0;
        do {
          lVar23 = uVar25 + lVar29;
          auVar84 = *(undefined1 (*) [64])((long)scales->data + uVar25 * 4 + lVar29 * 4);
          if (max_kk < 0x10 || iVar8 != 0x10) {
            pauVar24 = (undefined1 (*) [64])
                       ((long)A->data + lVar23 * lVar28 * 4 + (long)(iVar4 * k) * 4);
          }
          else {
            iVar9 = 0xf;
            pauVar24 = (undefined1 (*) [64])((long)A->data + lVar19);
            do {
              pauVar21 = pauVar24;
              pvVar5 = scales->data;
              auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4)));
              auVar72 = vmulps_avx512f(auVar72,*pauVar21);
              auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 4)));
              auVar73 = vmulps_avx512f(auVar73,pauVar21[1]);
              auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 8)));
              auVar74 = vmulps_avx512f(auVar74,pauVar21[2]);
              auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0xc)));
              auVar75 = vmulps_avx512f(auVar75,pauVar21[3]);
              auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x10)));
              auVar76 = vmulps_avx512f(auVar76,pauVar21[4]);
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x14)));
              auVar77 = vmulps_avx512f(auVar77,pauVar21[5]);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x18)));
              auVar78 = vmulps_avx512f(auVar78,pauVar21[6]);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x1c)));
              auVar79 = vmulps_avx512f(auVar79,pauVar21[7]);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x20)));
              auVar80 = vmulps_avx512f(auVar80,pauVar21[8]);
              auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x24)));
              auVar81 = vmulps_avx512f(auVar81,pauVar21[9]);
              auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x28)));
              auVar82 = vmulps_avx512f(auVar82,pauVar21[10]);
              auVar83 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x2c)));
              auVar83 = vmulps_avx512f(auVar83,pauVar21[0xb]);
              auVar67 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x30)));
              auVar67 = vmulps_avx512f(auVar67,pauVar21[0xc]);
              auVar68 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x34)));
              auVar68 = vmulps_avx512f(auVar68,pauVar21[0xd]);
              auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x38)));
              auVar69 = vmulps_avx512f(auVar69,pauVar21[0xe]);
              auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x3c)));
              auVar70 = vmulps_avx512f(auVar70,pauVar21[0xf]);
              auVar71 = vmovdqa64_avx512f(auVar62);
              auVar71 = vpternlogd_avx512f(auVar71,auVar72,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar72,auVar71);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar30 = vpmovsdb_avx512f(auVar72);
              auVar30 = vpmaxsb_avx(auVar30,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar73,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar73,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar31 = vpmovsdb_avx512f(auVar72);
              auVar31 = vpmaxsb_avx(auVar31,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar74,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar74,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar32 = vpmovsdb_avx512f(auVar72);
              auVar32 = vpmaxsb_avx(auVar32,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar75,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar75,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar33 = vpmovsdb_avx512f(auVar72);
              auVar33 = vpmaxsb_avx(auVar33,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar76,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar76,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar39 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar77,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar77,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar40 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar78,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar78,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar38 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar79,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar79,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar41 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar80,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar80,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar42 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar81,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar81,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar43 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar82,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar82,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar44 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar83,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar83,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar45 = vpmaxsb_avx512vl(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar67,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar67,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar34 = vpmovsdb_avx512f(auVar72);
              auVar34 = vpmaxsb_avx(auVar34,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar68,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar68,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar35 = vpmovsdb_avx512f(auVar72);
              auVar35 = vpmaxsb_avx(auVar35,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar69,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar69,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar36 = vpmovsdb_avx512f(auVar72);
              auVar36 = vpmaxsb_avx(auVar36,auVar47);
              auVar72 = vmovdqa64_avx512f(auVar62);
              auVar72 = vpternlogd_avx512f(auVar72,auVar70,auVar61,0xf8);
              auVar72 = vaddps_avx512f(auVar70,auVar72);
              auVar72 = vcvttps2dq_avx512f(auVar72);
              auVar37 = vpmovsdb_avx512f(auVar72);
              auVar37 = vpmaxsb_avx(auVar37,auVar47);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar42),auVar34,1);
              in_ZMM15 = ZEXT3264(auVar48);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar30),auVar39,1);
              auVar72 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar43),auVar35,1);
              in_ZMM14 = ZEXT3264(auVar48);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar31),auVar40,1);
              auVar73 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar44),auVar36,1);
              in_ZMM13 = ZEXT3264(auVar48);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar32),auVar38,1);
              auVar74 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar45),auVar37,1);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar33),auVar41,1);
              auVar75 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
              auVar76 = vpunpcklwd_avx512bw(auVar72,auVar73);
              auVar72 = vpunpckhwd_avx512bw(auVar72,auVar73);
              auVar73 = vpunpcklwd_avx512bw(auVar74,auVar75);
              in_ZMM10 = vpunpckhwd_avx512bw(auVar74,auVar75);
              auVar74 = vmovdqa64_avx512f(auVar76);
              auVar74 = vpermt2d_avx512f(auVar74,auVar65,auVar73);
              auVar73 = vpermt2d_avx512f(auVar76,auVar66,auVar73);
              auVar75 = vmovdqa64_avx512f(auVar72);
              in_ZMM9 = vpermt2d_avx512f(auVar75,auVar65,in_ZMM10);
              auVar75 = vpermt2d_avx512f(auVar72,auVar66,in_ZMM10);
              auVar72 = vmovdqa64_avx512f(auVar74);
              *pauVar13 = auVar72;
              auVar72 = vmovdqa64_avx512f(auVar73);
              pauVar13[1] = auVar72;
              auVar72 = vmovdqa64_avx512f(in_ZMM9);
              pauVar13[2] = auVar72;
              auVar72 = vmovdqa64_avx512f(auVar75);
              pauVar13[3] = auVar72;
              pauVar13 = pauVar13 + 4;
              iVar9 = iVar9 + 0x10;
              pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
            } while (iVar9 < max_kk);
            pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
          }
          if (iVar8 == 8) {
            if (7 < max_kk) {
              auVar72 = vshufps_avx512f(auVar84,auVar84,0);
              auVar73 = vshufps_avx512f(auVar84,auVar84,0x55);
              auVar74 = vshufps_avx512f(auVar84,auVar84,0xaa);
              auVar75 = vshufps_avx512f(auVar84,auVar84,0xff);
              auVar76 = vshuff64x2_avx512f(auVar72,auVar73,0);
              in_ZMM9 = vshuff64x2_avx512f(auVar74,auVar75,0);
              in_ZMM10 = vshuff64x2_avx512f(auVar72,auVar73,0x55);
              auVar77 = vshuff64x2_avx512f(auVar74,auVar75,0x55);
              auVar78 = vshuff64x2_avx512f(auVar72,auVar73,0xaa);
              in_ZMM13 = vshuff64x2_avx512f(auVar74,auVar75,0xaa);
              in_ZMM14 = vshuff64x2_avx512f(auVar72,auVar73,0xff);
              in_ZMM15 = vshuff64x2_avx512f(auVar74,auVar75,0xff);
              iVar9 = 7;
              do {
                auVar72 = vmulps_avx512f(auVar76,*pauVar24);
                auVar73 = vmulps_avx512f(in_ZMM9,pauVar24[1]);
                auVar74 = vmulps_avx512f(in_ZMM10,pauVar24[2]);
                auVar75 = vmulps_avx512f(auVar77,pauVar24[3]);
                auVar79 = vmulps_avx512f(auVar78,pauVar24[4]);
                auVar80 = vmulps_avx512f(in_ZMM13,pauVar24[5]);
                auVar81 = vmulps_avx512f(in_ZMM14,pauVar24[6]);
                auVar82 = vmulps_avx512f(in_ZMM15,pauVar24[7]);
                auVar83 = vmovdqa64_avx512f(auVar62);
                auVar83 = vpternlogd_avx512f(auVar83,auVar72,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar72,auVar83);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar30 = vpmovsdb_avx512f(auVar72);
                auVar30 = vpmaxsb_avx512vl(auVar30,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar73,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar73,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar31 = vpmovsdb_avx512f(auVar72);
                auVar31 = vpmaxsb_avx512vl(auVar31,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar74,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar74,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar32 = vpmovsdb_avx512f(auVar72);
                auVar32 = vpmaxsb_avx512vl(auVar32,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar75,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar75,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar33 = vpmovsdb_avx512f(auVar72);
                auVar33 = vpmaxsb_avx512vl(auVar33,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar79,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar79,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar34 = vpmovsdb_avx512f(auVar72);
                auVar34 = vpmaxsb_avx512vl(auVar34,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar80,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar80,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar35 = vpmovsdb_avx512f(auVar72);
                auVar35 = vpmaxsb_avx512vl(auVar35,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar81,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar81,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar36 = vpmovsdb_avx512f(auVar72);
                auVar36 = vpmaxsb_avx512vl(auVar36,auVar47);
                auVar72 = vmovdqa64_avx512f(auVar62);
                auVar72 = vpternlogd_avx512f(auVar72,auVar82,auVar61,0xf8);
                auVar72 = vaddps_avx512f(auVar82,auVar72);
                auVar72 = vcvttps2dq_avx512f(auVar72);
                auVar37 = vpmovsdb_avx512f(auVar72);
                auVar37 = vpmaxsb_avx512vl(auVar37,auVar47);
                auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar34),auVar36,1);
                auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar30),auVar32,1);
                auVar72 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
                auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar35),auVar37,1);
                auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar31),auVar33,1);
                auVar73 = vinserti64x4_avx512f(ZEXT3264(auVar49),auVar48,1);
                auVar74 = vpunpcklwd_avx512bw(auVar72,auVar73);
                auVar72 = vpunpckhwd_avx512bw(auVar72,auVar73);
                auVar73 = vmovdqa64_avx512f(auVar74);
                auVar73 = vpermt2w_avx512bw(auVar73,auVar63,auVar72);
                auVar74 = vpermt2w_avx512bw(auVar74,auVar64,auVar72);
                auVar72 = vmovdqa64_avx512f(auVar73);
                *pauVar13 = auVar72;
                auVar72 = vmovdqa64_avx512f(auVar74);
                pauVar13[1] = auVar72;
                pauVar13 = pauVar13 + 2;
                pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar4 * 8) * 4);
                iVar9 = iVar9 + 8;
              } while (iVar9 < max_kk);
              goto LAB_004b061e;
            }
          }
          else {
LAB_004b061e:
            if (iVar8 == 4) {
              if (max_kk < 4) goto LAB_004b085c;
              auVar72 = vshufps_avx512f(auVar84,auVar84,0);
              auVar73 = vshufps_avx512f(auVar84,auVar84,0x55);
              auVar74 = vshufps_avx512f(auVar84,auVar84,0xaa);
              auVar75 = vshufps_avx512f(auVar84,auVar84,0xff);
              auVar76 = vshuff64x2_avx512f(auVar72,auVar73,0x88);
              auVar77 = vshuff64x2_avx512f(auVar74,auVar75,0x88);
              auVar72 = vshuff64x2_avx512f(auVar72,auVar73,0xdd);
              auVar73 = vshuff64x2_avx512f(auVar74,auVar75,0xdd);
              auVar74 = vshuff64x2_avx512f(auVar76,auVar77,0x88);
              in_ZMM9 = vshuff64x2_avx512f(auVar72,auVar73,0x88);
              in_ZMM10 = vshuff64x2_avx512f(auVar76,auVar77,0xdd);
              auVar72 = vshuff64x2_avx512f(auVar72,auVar73,0xdd);
              iVar9 = 3;
              do {
                auVar73 = vmulps_avx512f(auVar74,*pauVar24);
                auVar75 = vmulps_avx512f(in_ZMM9,pauVar24[1]);
                auVar76 = vmulps_avx512f(in_ZMM10,pauVar24[2]);
                auVar77 = vmulps_avx512f(auVar72,pauVar24[3]);
                auVar78 = vmovdqa64_avx512f(auVar62);
                auVar78 = vpternlogd_avx512f(auVar78,auVar73,auVar61,0xf8);
                auVar73 = vaddps_avx512f(auVar73,auVar78);
                auVar73 = vcvttps2dq_avx512f(auVar73);
                auVar30 = vpmovsdb_avx512f(auVar73);
                auVar30 = vpmaxsb_avx(auVar30,auVar47);
                auVar73 = vmovdqa64_avx512f(auVar62);
                auVar73 = vpternlogd_avx512f(auVar73,auVar75,auVar61,0xf8);
                auVar73 = vaddps_avx512f(auVar75,auVar73);
                auVar73 = vcvttps2dq_avx512f(auVar73);
                auVar31 = vpmovsdb_avx512f(auVar73);
                auVar31 = vpmaxsb_avx(auVar31,auVar47);
                auVar73 = vmovdqa64_avx512f(auVar62);
                auVar73 = vpternlogd_avx512f(auVar73,auVar76,auVar61,0xf8);
                auVar73 = vaddps_avx512f(auVar76,auVar73);
                auVar73 = vcvttps2dq_avx512f(auVar73);
                auVar32 = vpmovsdb_avx512f(auVar73);
                auVar32 = vpmaxsb_avx(auVar32,auVar47);
                auVar73 = vmovdqa64_avx512f(auVar62);
                auVar73 = vpternlogd_avx512f(auVar73,auVar77,auVar61,0xf8);
                auVar73 = vaddps_avx512f(auVar77,auVar73);
                auVar73 = vcvttps2dq_avx512f(auVar73);
                auVar33 = vpmovsdb_avx512f(auVar73);
                auVar33 = vpmaxsb_avx(auVar33,auVar47);
                in_ZMM15 = ZEXT1664(auVar33);
                auVar48._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar30;
                auVar48._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
                auVar50._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar31;
                auVar50._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
                auVar49 = vpunpcklwd_avx2(auVar48,auVar50);
                auVar48 = vpunpckhwd_avx2(auVar48,auVar50);
                auVar50 = vpunpcklwd_avx2(auVar49,auVar48);
                in_ZMM13 = ZEXT3264(auVar50);
                auVar48 = vpunpckhwd_avx2(auVar49,auVar48);
                auVar49 = vpunpcklwd_avx2(auVar50,auVar48);
                in_ZMM14 = ZEXT3264(auVar49);
                auVar48 = vpunpckhwd_avx2(auVar50,auVar48);
                *(undefined1 (*) [32])*pauVar13 = auVar49;
                *(undefined1 (*) [32])(*pauVar13 + 0x20) = auVar48;
                pauVar13 = pauVar13 + 1;
                pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar4 * 4) * 4);
                iVar9 = iVar9 + 4;
              } while (iVar9 < max_kk);
            }
            if (iVar8 == 1) {
              uVar22 = 0;
              if (1 < max_kk) {
                iVar9 = 1;
                do {
                  auVar72 = vmulps_avx512f(auVar84,*pauVar24);
                  auVar73 = vmulps_avx512f(auVar84,*(undefined1 (*) [64])(*pauVar24 + lVar18 * 4));
                  auVar74 = vmovdqa64_avx512f(auVar62);
                  auVar74 = vpternlogd_avx512f(auVar74,auVar72,auVar61,0xf8);
                  auVar72 = vaddps_avx512f(auVar72,auVar74);
                  auVar72 = vcvttps2dq_avx512f(auVar72);
                  auVar30 = vpmovsdb_avx512f(auVar72);
                  auVar30 = vpmaxsb_avx(auVar30,auVar47);
                  auVar72 = vmovdqa64_avx512f(auVar62);
                  auVar72 = vpternlogd_avx512f(auVar72,auVar73,auVar61,0xf8);
                  auVar72 = vaddps_avx512f(auVar73,auVar72);
                  auVar72 = vcvttps2dq_avx512f(auVar72);
                  auVar31 = vpmovsdb_avx512f(auVar72);
                  auVar31 = vpmaxsb_avx(auVar31,auVar47);
                  in_ZMM9 = ZEXT1664(auVar31);
                  auVar32 = vpunpcklbw_avx(auVar30,auVar31);
                  in_ZMM10 = ZEXT1664(auVar32);
                  auVar30 = vpunpckhbw_avx(auVar30,auVar31);
                  *(undefined1 (*) [16])*pauVar13 = auVar32;
                  *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar30;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
                  pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar4 * 2) * 4);
                  iVar9 = iVar9 + 2;
                  uVar22 = local_60;
                } while (iVar9 < max_kk);
              }
              iVar9 = max_kk - uVar22;
              if (iVar9 != 0 && (int)uVar22 <= max_kk) {
                do {
                  auVar72 = vmulps_avx512f(auVar84,*pauVar24);
                  auVar73 = vmovdqa64_avx512f(auVar62);
                  in_ZMM9 = vpternlogd_avx512f(auVar73,auVar72,auVar61,0xf8);
                  auVar72 = vaddps_avx512f(auVar72,in_ZMM9);
                  auVar72 = vcvttps2dq_avx512f(auVar72);
                  auVar30 = vpmovsdb_avx512f(auVar72);
                  auVar30 = vpmaxsb_avx(auVar30,auVar47);
                  *(undefined1 (*) [16])*pauVar13 = auVar30;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                  pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar18 * 4);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
            }
          }
LAB_004b085c:
          uVar12 = uVar25 + 0x10;
          uVar14 = uVar25 + 0x1f;
          lVar19 = lVar19 + lVar28 * 0x40;
          uVar25 = uVar12;
        } while (uVar14 < (uint)max_ii);
      }
      auVar47 = _DAT_005b25a0;
      if ((int)((uint)uVar12 | 7) < max_ii) {
        local_48 = max_kk & 0xfffffffe;
        lVar19 = (long)(iVar4 * k) * 4 + (lVar29 + (uVar12 & 0xffffffff)) * lVar28 * 4;
        auVar49._8_4_ = 0x80000000;
        auVar49._0_8_ = 0x8000000080000000;
        auVar49._12_4_ = 0x80000000;
        auVar49._16_4_ = 0x80000000;
        auVar49._20_4_ = 0x80000000;
        auVar49._24_4_ = 0x80000000;
        auVar49._28_4_ = 0x80000000;
        auVar58._8_4_ = 0x3f000000;
        auVar58._0_8_ = 0x3f0000003f000000;
        auVar58._12_4_ = 0x3f000000;
        auVar58._16_4_ = 0x3f000000;
        auVar58._20_4_ = 0x3f000000;
        auVar58._24_4_ = 0x3f000000;
        auVar58._28_4_ = 0x3f000000;
        auVar59._8_2_ = 0x7f;
        auVar59._0_8_ = 0x7f007f007f007f;
        auVar59._10_2_ = 0x7f;
        auVar59._12_2_ = 0x7f;
        auVar59._14_2_ = 0x7f;
        auVar59._16_2_ = 0x7f;
        auVar59._18_2_ = 0x7f;
        auVar59._20_2_ = 0x7f;
        auVar59._22_2_ = 0x7f;
        auVar59._24_2_ = 0x7f;
        auVar59._26_2_ = 0x7f;
        auVar59._28_2_ = 0x7f;
        auVar59._30_2_ = 0x7f;
        auVar60._8_2_ = 0xff81;
        auVar60._0_8_ = 0xff81ff81ff81ff81;
        auVar60._10_2_ = 0xff81;
        auVar60._12_2_ = 0xff81;
        auVar60._14_2_ = 0xff81;
        auVar60._16_2_ = 0xff81;
        auVar60._18_2_ = 0xff81;
        auVar60._20_2_ = 0xff81;
        auVar60._22_2_ = 0xff81;
        auVar60._24_2_ = 0xff81;
        auVar60._26_2_ = 0xff81;
        auVar60._28_2_ = 0xff81;
        auVar60._30_2_ = 0xff81;
        auVar30[8] = 0x81;
        auVar30._0_8_ = 0x8181818181818181;
        auVar30[9] = 0x81;
        auVar30[10] = 0x81;
        auVar30[0xb] = 0x81;
        auVar30[0xc] = 0x81;
        auVar30[0xd] = 0x81;
        auVar30[0xe] = 0x81;
        auVar30[0xf] = 0x81;
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        uVar25 = uVar12 & 0xffffffff;
        do {
          lVar23 = uVar25 + lVar29;
          auVar48 = *(undefined1 (*) [32])((long)scales->data + uVar25 * 4 + lVar29 * 4);
          if (max_kk < 0x10 || iVar8 != 0x10) {
            pfVar20 = (float *)((long)A->data + lVar23 * lVar28 * 4 + (long)(iVar4 * k) * 4);
          }
          else {
            iVar9 = 0xf;
            pauVar24 = (undefined1 (*) [64])((long)A->data + lVar19);
            do {
              pauVar21 = pauVar24;
              pvVar5 = scales->data;
              auVar63 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4)));
              auVar63 = vmulps_avx512f(auVar63,*pauVar21);
              auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 4)));
              auVar64 = vmulps_avx512f(auVar64,pauVar21[1]);
              auVar65 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 8)));
              auVar65 = vmulps_avx512f(auVar65,pauVar21[2]);
              auVar66 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0xc)));
              auVar66 = vmulps_avx512f(auVar66,pauVar21[3]);
              auVar84 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x10)));
              auVar84 = vmulps_avx512f(auVar84,pauVar21[4]);
              auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x14)));
              auVar72 = vmulps_avx512f(auVar72,pauVar21[5]);
              auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x18)));
              auVar73 = vmulps_avx512f(auVar73,pauVar21[6]);
              auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x1c)));
              auVar74 = vmulps_avx512f(auVar74,pauVar21[7]);
              auVar75 = vmovdqa64_avx512f(auVar62);
              auVar75 = vpternlogd_avx512f(auVar75,auVar63,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar63,auVar75);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar31 = vpmovsdb_avx512f(auVar63);
              auVar31 = vpmaxsb_avx(auVar31,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar64,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar64,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar32 = vpmovsdb_avx512f(auVar63);
              auVar32 = vpmaxsb_avx(auVar32,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar65,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar65,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar33 = vpmovsdb_avx512f(auVar63);
              auVar33 = vpmaxsb_avx(auVar33,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar66,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar66,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar34 = vpmovsdb_avx512f(auVar63);
              auVar34 = vpmaxsb_avx(auVar34,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar84,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar84,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar35 = vpmovsdb_avx512f(auVar63);
              auVar35 = vpmaxsb_avx(auVar35,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar72,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar72,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar36 = vpmovsdb_avx512f(auVar63);
              auVar36 = vpmaxsb_avx(auVar36,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar73,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar73,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar37 = vpmovsdb_avx512f(auVar63);
              auVar37 = vpmaxsb_avx(auVar37,auVar30);
              auVar63 = vmovdqa64_avx512f(auVar62);
              auVar63 = vpternlogd_avx512f(auVar63,auVar74,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar74,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar39 = vpmovsdb_avx512f(auVar63);
              auVar40 = vpmaxsb_avx512vl(auVar39,auVar30);
              auVar38 = vpunpcklwd_avx512vl(auVar31,auVar32);
              auVar31 = vpunpckhwd_avx(auVar31,auVar32);
              auVar39 = vpunpcklwd_avx(auVar33,auVar34);
              auVar32 = vpunpckhwd_avx(auVar33,auVar34);
              auVar34 = vpunpcklwd_avx(auVar35,auVar36);
              auVar33 = vpunpckhwd_avx(auVar35,auVar36);
              auVar36 = vpunpcklwd_avx512vl(auVar37,auVar40);
              auVar37 = vpunpckhwd_avx512vl(auVar37,auVar40);
              auVar40 = vpunpckldq_avx512vl(auVar38,auVar39);
              auVar39 = vpunpckhdq_avx512vl(auVar38,auVar39);
              auVar38 = vpunpckldq_avx512vl(auVar31,auVar32);
              auVar31 = vpunpckhdq_avx(auVar31,auVar32);
              auVar35 = vpunpckldq_avx(auVar34,auVar36);
              auVar32 = vpunpckhdq_avx(auVar34,auVar36);
              auVar34 = vpunpckldq_avx(auVar33,auVar37);
              auVar33 = vpunpckhdq_avx(auVar33,auVar37);
              in_ZMM13 = ZEXT1664(auVar33);
              auVar36 = vpunpcklqdq_avx512vl(auVar40,auVar35);
              in_ZMM15 = ZEXT1664(auVar36);
              auVar35 = vpunpckhqdq_avx512vl(auVar40,auVar35);
              auVar37 = vpunpcklqdq_avx512vl(auVar39,auVar32);
              auVar32 = vpunpckhqdq_avx(auVar39,auVar32);
              auVar39 = vpunpcklqdq_avx512vl(auVar38,auVar34);
              auVar34 = vpunpckhqdq_avx512vl(auVar38,auVar34);
              in_ZMM14 = ZEXT1664(auVar34);
              auVar40 = vpunpcklqdq_avx512vl(auVar31,auVar33);
              auVar31 = vpunpckhqdq_avx(auVar31,auVar33);
              auVar50 = vinserti32x4_avx512vl(ZEXT1632(auVar37),auVar32,1);
              in_ZMM10 = vinserti64x4_avx512f
                                   (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar35,
                                                        ZEXT116(0) * auVar35 + ZEXT116(1) * auVar36)
                                            ),auVar50,1);
              auVar50 = vinserti32x4_avx512vl(ZEXT1632(auVar40),auVar31,1);
              in_ZMM9 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar34,
                                                       ZEXT116(0) * auVar34 + ZEXT116(1) * auVar39))
                                   ,auVar50,1);
              auVar63 = vmovdqa64_avx512f(in_ZMM10);
              *pauVar13 = auVar63;
              auVar63 = vmovdqa64_avx512f(in_ZMM9);
              pauVar13[1] = auVar63;
              pauVar13 = pauVar13 + 2;
              iVar9 = iVar9 + 0x10;
              pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
            } while (iVar9 < max_kk);
            pfVar20 = (float *)(*pauVar21 + (long)(iVar4 << 4) * 4);
          }
          if (7 < max_kk && iVar8 == 8) {
            iVar9 = 7;
            do {
              pvVar5 = scales->data;
              fVar99 = *(float *)((long)pvVar5 + lVar23 * 4);
              auVar53._4_4_ = fVar99 * pfVar20[1];
              auVar53._0_4_ = fVar99 * *pfVar20;
              auVar53._8_4_ = fVar99 * pfVar20[2];
              auVar53._12_4_ = fVar99 * pfVar20[3];
              auVar53._16_4_ = fVar99 * pfVar20[4];
              auVar53._20_4_ = fVar99 * pfVar20[5];
              auVar53._24_4_ = fVar99 * pfVar20[6];
              auVar53._28_4_ = fVar99;
              fVar99 = *(float *)((long)pvVar5 + lVar23 * 4 + 4);
              auVar54._4_4_ = fVar99 * pfVar20[9];
              auVar54._0_4_ = fVar99 * pfVar20[8];
              auVar54._8_4_ = fVar99 * pfVar20[10];
              auVar54._12_4_ = fVar99 * pfVar20[0xb];
              auVar54._16_4_ = fVar99 * pfVar20[0xc];
              auVar54._20_4_ = fVar99 * pfVar20[0xd];
              auVar54._24_4_ = fVar99 * pfVar20[0xe];
              auVar54._28_4_ = fVar99;
              fVar102 = *(float *)((long)pvVar5 + lVar23 * 4 + 8);
              auVar55._4_4_ = fVar102 * pfVar20[0x11];
              auVar55._0_4_ = fVar102 * pfVar20[0x10];
              auVar55._8_4_ = fVar102 * pfVar20[0x12];
              auVar55._12_4_ = fVar102 * pfVar20[0x13];
              auVar55._16_4_ = fVar102 * pfVar20[0x14];
              auVar55._20_4_ = fVar102 * pfVar20[0x15];
              auVar55._24_4_ = fVar102 * pfVar20[0x16];
              auVar55._28_4_ = fVar102;
              fVar102 = *(float *)((long)pvVar5 + lVar23 * 4 + 0xc);
              auVar6._4_4_ = fVar102 * pfVar20[0x19];
              auVar6._0_4_ = fVar102 * pfVar20[0x18];
              auVar6._8_4_ = fVar102 * pfVar20[0x1a];
              auVar6._12_4_ = fVar102 * pfVar20[0x1b];
              auVar6._16_4_ = fVar102 * pfVar20[0x1c];
              auVar6._20_4_ = fVar102 * pfVar20[0x1d];
              auVar6._24_4_ = fVar102 * pfVar20[0x1e];
              auVar6._28_4_ = fVar102;
              fVar102 = *(float *)((long)pvVar5 + lVar23 * 4 + 0x10);
              auVar7._4_4_ = fVar102 * pfVar20[0x21];
              auVar7._0_4_ = fVar102 * pfVar20[0x20];
              auVar7._8_4_ = fVar102 * pfVar20[0x22];
              auVar7._12_4_ = fVar102 * pfVar20[0x23];
              auVar7._16_4_ = fVar102 * pfVar20[0x24];
              auVar7._20_4_ = fVar102 * pfVar20[0x25];
              auVar7._24_4_ = fVar102 * pfVar20[0x26];
              auVar7._28_4_ = fVar102;
              in_ZMM13 = ZEXT3264(auVar7);
              fVar103 = *(float *)((long)pvVar5 + lVar23 * 4 + 0x14);
              auVar57._4_4_ = fVar103 * pfVar20[0x29];
              auVar57._0_4_ = fVar103 * pfVar20[0x28];
              auVar57._8_4_ = fVar103 * pfVar20[0x2a];
              auVar57._12_4_ = fVar103 * pfVar20[0x2b];
              auVar57._16_4_ = fVar103 * pfVar20[0x2c];
              auVar57._20_4_ = fVar103 * pfVar20[0x2d];
              auVar57._24_4_ = fVar103 * pfVar20[0x2e];
              auVar57._28_4_ = fVar103;
              in_ZMM14 = ZEXT3264(auVar57);
              fVar104 = *(float *)((long)pvVar5 + lVar23 * 4 + 0x18);
              auVar56._4_4_ = fVar104 * pfVar20[0x31];
              auVar56._0_4_ = fVar104 * pfVar20[0x30];
              auVar56._8_4_ = fVar104 * pfVar20[0x32];
              auVar56._12_4_ = fVar104 * pfVar20[0x33];
              auVar56._16_4_ = fVar104 * pfVar20[0x34];
              auVar56._20_4_ = fVar104 * pfVar20[0x35];
              auVar56._24_4_ = fVar104 * pfVar20[0x36];
              auVar56._28_4_ = fVar104;
              in_ZMM15 = ZEXT3264(auVar56);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0x1c)));
              auVar51 = vmulps_avx512vl(auVar50,*(undefined1 (*) [32])(pfVar20 + 0x38));
              auVar50 = vmovdqa64_avx512vl(auVar58);
              auVar50 = vpternlogd_avx512vl(auVar50,auVar53,auVar49,0xf8);
              auVar52 = vmovdqa64_avx512vl(auVar58);
              auVar52 = vpternlogd_avx512vl(auVar52,auVar55,auVar49,0xf8);
              auVar50 = vaddps_avx512vl(auVar53,auVar50);
              auVar53 = vaddps_avx512vl(auVar55,auVar52);
              auVar52._0_4_ = (int)auVar50._0_4_;
              auVar52._4_4_ = (int)auVar50._4_4_;
              auVar52._8_4_ = (int)auVar50._8_4_;
              auVar52._12_4_ = (int)auVar50._12_4_;
              auVar52._16_4_ = (int)auVar50._16_4_;
              auVar52._20_4_ = (int)auVar50._20_4_;
              auVar52._24_4_ = (int)auVar50._24_4_;
              auVar52._28_4_ = (int)auVar50._28_4_;
              auVar117._0_4_ = (int)auVar53._0_4_;
              auVar117._4_4_ = (int)auVar53._4_4_;
              auVar117._8_4_ = (int)auVar53._8_4_;
              auVar117._12_4_ = (int)auVar53._12_4_;
              auVar117._16_4_ = (int)auVar53._16_4_;
              auVar117._20_4_ = (int)auVar53._20_4_;
              auVar117._24_4_ = (int)auVar53._24_4_;
              auVar117._28_4_ = (int)auVar53._28_4_;
              auVar50 = vpackssdw_avx2(auVar52,auVar117);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              auVar50 = vpminsw_avx2(auVar50,auVar59);
              auVar53 = vpmaxsw_avx2(auVar50,auVar60);
              auVar50 = vpternlogd_avx512vl(auVar58,auVar54,auVar49,0xf8);
              auVar54 = vmovdqa64_avx512vl(auVar58);
              auVar54 = vpternlogd_avx512vl(auVar54,auVar6,auVar49,0xf8);
              auVar54 = vaddps_avx512vl(auVar6,auVar54);
              auVar114._0_4_ = (int)(fVar99 * pfVar20[8] + auVar50._0_4_);
              auVar114._4_4_ = (int)(fVar99 * pfVar20[9] + auVar50._4_4_);
              auVar114._8_4_ = (int)(fVar99 * pfVar20[10] + auVar50._8_4_);
              auVar114._12_4_ = (int)(fVar99 * pfVar20[0xb] + auVar50._12_4_);
              auVar114._16_4_ = (int)(fVar99 * pfVar20[0xc] + auVar50._16_4_);
              auVar114._20_4_ = (int)(fVar99 * pfVar20[0xd] + auVar50._20_4_);
              auVar114._24_4_ = (int)(fVar99 * pfVar20[0xe] + auVar50._24_4_);
              auVar114._28_4_ = (int)(fVar99 + auVar50._28_4_);
              auVar118._0_4_ = (int)auVar54._0_4_;
              auVar118._4_4_ = (int)auVar54._4_4_;
              auVar118._8_4_ = (int)auVar54._8_4_;
              auVar118._12_4_ = (int)auVar54._12_4_;
              auVar118._16_4_ = (int)auVar54._16_4_;
              auVar118._20_4_ = (int)auVar54._20_4_;
              auVar118._24_4_ = (int)auVar54._24_4_;
              auVar118._28_4_ = (int)auVar54._28_4_;
              auVar50 = vpackssdw_avx2(auVar114,auVar118);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              auVar50 = vpminsw_avx2(auVar50,auVar59);
              auVar54 = vpmaxsw_avx2(auVar50,auVar60);
              auVar50 = vpternlogd_avx512vl(auVar58,auVar7,auVar49,0xf8);
              auVar55 = vpternlogd_avx512vl(auVar58,auVar56,auVar49,0xf8);
              auVar119._0_4_ = (int)(fVar102 * pfVar20[0x20] + auVar50._0_4_);
              auVar119._4_4_ = (int)(fVar102 * pfVar20[0x21] + auVar50._4_4_);
              auVar119._8_4_ = (int)(fVar102 * pfVar20[0x22] + auVar50._8_4_);
              auVar119._12_4_ = (int)(fVar102 * pfVar20[0x23] + auVar50._12_4_);
              auVar119._16_4_ = (int)(fVar102 * pfVar20[0x24] + auVar50._16_4_);
              auVar119._20_4_ = (int)(fVar102 * pfVar20[0x25] + auVar50._20_4_);
              auVar119._24_4_ = (int)(fVar102 * pfVar20[0x26] + auVar50._24_4_);
              auVar119._28_4_ = (int)(fVar102 + auVar50._28_4_);
              auVar121._0_4_ = (int)(fVar104 * pfVar20[0x30] + auVar55._0_4_);
              auVar121._4_4_ = (int)(fVar104 * pfVar20[0x31] + auVar55._4_4_);
              auVar121._8_4_ = (int)(fVar104 * pfVar20[0x32] + auVar55._8_4_);
              auVar121._12_4_ = (int)(fVar104 * pfVar20[0x33] + auVar55._12_4_);
              auVar121._16_4_ = (int)(fVar104 * pfVar20[0x34] + auVar55._16_4_);
              auVar121._20_4_ = (int)(fVar104 * pfVar20[0x35] + auVar55._20_4_);
              auVar121._24_4_ = (int)(fVar104 * pfVar20[0x36] + auVar55._24_4_);
              auVar121._28_4_ = (int)(fVar104 + auVar55._28_4_);
              auVar50 = vpackssdw_avx2(auVar119,auVar121);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              auVar50 = vpminsw_avx2(auVar50,auVar59);
              auVar50 = vpmaxsw_avx2(auVar50,auVar60);
              auVar50 = vpacksswb_avx2(auVar53,auVar50);
              auVar53 = vpternlogd_avx512vl(auVar58,auVar57,auVar49,0xf8);
              auVar55 = vpternlogd_avx512vl(auVar58,auVar51,auVar49,0xf8);
              auVar55 = vaddps_avx512vl(auVar51,auVar55);
              auVar51._0_4_ = (int)(fVar103 * pfVar20[0x28] + auVar53._0_4_);
              auVar51._4_4_ = (int)(fVar103 * pfVar20[0x29] + auVar53._4_4_);
              auVar51._8_4_ = (int)(fVar103 * pfVar20[0x2a] + auVar53._8_4_);
              auVar51._12_4_ = (int)(fVar103 * pfVar20[0x2b] + auVar53._12_4_);
              auVar51._16_4_ = (int)(fVar103 * pfVar20[0x2c] + auVar53._16_4_);
              auVar51._20_4_ = (int)(fVar103 * pfVar20[0x2d] + auVar53._20_4_);
              auVar51._24_4_ = (int)(fVar103 * pfVar20[0x2e] + auVar53._24_4_);
              auVar51._28_4_ = (int)(fVar103 + auVar53._28_4_);
              auVar122._0_4_ = (int)auVar55._0_4_;
              auVar122._4_4_ = (int)auVar55._4_4_;
              auVar122._8_4_ = (int)auVar55._8_4_;
              auVar122._12_4_ = (int)auVar55._12_4_;
              auVar122._16_4_ = (int)auVar55._16_4_;
              auVar122._20_4_ = (int)auVar55._20_4_;
              auVar122._24_4_ = (int)auVar55._24_4_;
              auVar122._28_4_ = (int)auVar55._28_4_;
              auVar53 = vpackssdw_avx2(auVar51,auVar122);
              auVar53 = vpermq_avx2(auVar53,0xd8);
              auVar53 = vpminsw_avx2(auVar53,auVar59);
              auVar53 = vpmaxsw_avx2(auVar53,auVar60);
              auVar53 = vpacksswb_avx2(auVar54,auVar53);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              auVar54 = vpermq_avx2(auVar53,0xd8);
              auVar53 = vpunpcklwd_avx2(auVar50,auVar54);
              auVar50 = vpunpckhwd_avx2(auVar50,auVar54);
              auVar54 = vpunpckldq_avx2(auVar53,auVar50);
              auVar54 = vpermq_avx2(auVar54,0xd8);
              in_ZMM10 = ZEXT3264(auVar54);
              auVar50 = vpunpckhdq_avx2(auVar53,auVar50);
              auVar50 = vpermq_avx2(auVar50,0xd8);
              in_ZMM9 = ZEXT3264(auVar50);
              *(undefined1 (*) [32])*pauVar13 = auVar54;
              *(undefined1 (*) [32])(*pauVar13 + 0x20) = auVar50;
              pauVar13 = pauVar13 + 1;
              pfVar20 = pfVar20 + iVar4 * 8;
              iVar9 = iVar9 + 8;
            } while (iVar9 < max_kk);
          }
          if (iVar8 == 4) {
            if (3 < max_kk) {
              auVar50 = vshufps_avx(auVar48,auVar48,0);
              auVar53 = vshufps_avx(auVar48,auVar48,0x55);
              auVar54 = vshufps_avx(auVar48,auVar48,0xaa);
              in_ZMM13 = ZEXT3264(auVar54);
              auVar55 = vshufps_avx(auVar48,auVar48,0xff);
              in_ZMM14 = ZEXT3264(auVar55);
              in_ZMM9 = ZEXT3264(CONCAT1616(auVar53._0_16_,auVar50._0_16_));
              in_ZMM10 = ZEXT3264(CONCAT1616(auVar55._0_16_,auVar54._0_16_));
              auVar6 = vperm2f128_avx(auVar50,auVar53,0x31);
              auVar7 = vperm2f128_avx(auVar54,auVar55,0x31);
              iVar9 = 3;
              do {
                auVar63._0_4_ = auVar50._0_4_ * *pfVar20;
                auVar63._4_4_ = auVar50._4_4_ * pfVar20[1];
                auVar63._8_4_ = auVar50._8_4_ * pfVar20[2];
                auVar63._12_4_ = auVar50._12_4_ * pfVar20[3];
                auVar63._16_4_ = auVar53._0_4_ * pfVar20[4];
                auVar63._20_4_ = auVar53._4_4_ * pfVar20[5];
                auVar63._28_36_ = in_ZMM13._28_36_;
                auVar63._24_4_ = auVar53._8_4_ * pfVar20[6];
                auVar64._0_4_ = auVar54._0_4_ * pfVar20[8];
                auVar64._4_4_ = auVar54._4_4_ * pfVar20[9];
                auVar64._8_4_ = auVar54._8_4_ * pfVar20[10];
                auVar64._12_4_ = auVar54._12_4_ * pfVar20[0xb];
                auVar64._16_4_ = auVar55._0_4_ * pfVar20[0xc];
                auVar64._20_4_ = auVar55._4_4_ * pfVar20[0xd];
                auVar64._28_36_ = in_ZMM14._28_36_;
                auVar64._24_4_ = auVar55._8_4_ * pfVar20[0xe];
                auVar65._0_4_ = auVar6._0_4_ * pfVar20[0x10];
                auVar65._4_4_ = auVar6._4_4_ * pfVar20[0x11];
                auVar65._8_4_ = auVar6._8_4_ * pfVar20[0x12];
                auVar65._12_4_ = auVar6._12_4_ * pfVar20[0x13];
                auVar65._16_4_ = auVar6._16_4_ * pfVar20[0x14];
                auVar65._20_4_ = auVar6._20_4_ * pfVar20[0x15];
                auVar65._28_36_ = in_ZMM15._28_36_;
                auVar65._24_4_ = auVar6._24_4_ * pfVar20[0x16];
                auVar56 = vmulps_avx512vl(auVar7,*(undefined1 (*) [32])(pfVar20 + 0x18));
                auVar57 = vmovdqa64_avx512vl(auVar58);
                auVar57 = vpternlogd_avx512vl(auVar57,auVar63._0_32_,auVar49,0xf8);
                auVar51 = vmovdqa64_avx512vl(auVar58);
                auVar51 = vpternlogd_avx512vl(auVar51,auVar64._0_32_,auVar49,0xf8);
                auVar57 = vaddps_avx512vl(auVar63._0_32_,auVar57);
                auVar51 = vaddps_avx512vl(auVar64._0_32_,auVar51);
                auVar130._0_4_ = (int)auVar57._0_4_;
                auVar130._4_4_ = (int)auVar57._4_4_;
                auVar130._8_4_ = (int)auVar57._8_4_;
                auVar130._12_4_ = (int)auVar57._12_4_;
                auVar130._16_4_ = (int)auVar57._16_4_;
                auVar130._20_4_ = (int)auVar57._20_4_;
                auVar130._24_4_ = (int)auVar57._24_4_;
                auVar130._28_4_ = (int)auVar57._28_4_;
                auVar136._0_4_ = (int)auVar51._0_4_;
                auVar136._4_4_ = (int)auVar51._4_4_;
                auVar136._8_4_ = (int)auVar51._8_4_;
                auVar136._12_4_ = (int)auVar51._12_4_;
                auVar136._16_4_ = (int)auVar51._16_4_;
                auVar136._20_4_ = (int)auVar51._20_4_;
                auVar136._24_4_ = (int)auVar51._24_4_;
                auVar136._28_4_ = (int)auVar51._28_4_;
                auVar57 = vpackssdw_avx2(auVar130,auVar136);
                auVar57 = vpermq_avx2(auVar57,0xd8);
                auVar57 = vpminsw_avx2(auVar57,auVar59);
                auVar57 = vpmaxsw_avx2(auVar57,auVar60);
                auVar31 = vpacksswb_avx(auVar57._0_16_,auVar57._16_16_);
                auVar57 = vpternlogd_avx512vl(auVar58,auVar65._0_32_,auVar49,0xf8);
                auVar51 = vmovdqa64_avx512vl(auVar58);
                auVar51 = vpternlogd_avx512vl(auVar51,auVar56,auVar49,0xf8);
                auVar56 = vaddps_avx512vl(auVar56,auVar51);
                auVar137._0_4_ = (int)(auVar65._0_4_ + auVar57._0_4_);
                auVar137._4_4_ = (int)(auVar65._4_4_ + auVar57._4_4_);
                auVar137._8_4_ = (int)(auVar65._8_4_ + auVar57._8_4_);
                auVar137._12_4_ = (int)(auVar65._12_4_ + auVar57._12_4_);
                auVar137._16_4_ = (int)(auVar65._16_4_ + auVar57._16_4_);
                auVar137._20_4_ = (int)(auVar65._20_4_ + auVar57._20_4_);
                auVar137._24_4_ = (int)(auVar65._24_4_ + auVar57._24_4_);
                auVar137._28_4_ = (int)(in_ZMM15._28_4_ + auVar57._28_4_);
                auVar142._0_4_ = (int)auVar56._0_4_;
                auVar142._4_4_ = (int)auVar56._4_4_;
                auVar142._8_4_ = (int)auVar56._8_4_;
                auVar142._12_4_ = (int)auVar56._12_4_;
                auVar142._16_4_ = (int)auVar56._16_4_;
                auVar142._20_4_ = (int)auVar56._20_4_;
                auVar142._24_4_ = (int)auVar56._24_4_;
                auVar142._28_4_ = (int)auVar56._28_4_;
                auVar57 = vpackssdw_avx2(auVar137,auVar142);
                auVar57 = vpermq_avx2(auVar57,0xd8);
                auVar57 = vpminsw_avx2(auVar57,auVar59);
                auVar57 = vpmaxsw_avx2(auVar57,auVar60);
                auVar32 = vpacksswb_avx(auVar57._0_16_,auVar57._16_16_);
                in_ZMM14 = ZEXT1664(auVar32);
                auVar33 = vpunpcklwd_avx(auVar31,auVar32);
                auVar34 = vpunpckhwd_avx512vl(auVar31,auVar32);
                auVar35 = vpunpcklwd_avx512vl(auVar33,auVar34);
                auVar33 = vpunpckhwd_avx512vl(auVar33,auVar34);
                auVar33 = vpunpckhwd_avx512vl(auVar35,auVar33);
                in_ZMM15 = ZEXT1664(auVar33);
                auVar131._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar31;
                auVar131._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
                in_ZMM13 = ZEXT3264(auVar131);
                auVar31 = vpmovdw_avx512vl(auVar131);
                *(undefined1 (*) [16])*pauVar13 = auVar31;
                *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar33;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
                pfVar20 = pfVar20 + iVar4 * 4;
                iVar9 = iVar9 + 4;
              } while (iVar9 < max_kk);
              goto LAB_004b0f64;
            }
          }
          else {
LAB_004b0f64:
            if (iVar8 == 1) {
              fVar99 = auVar48._0_4_;
              fVar102 = auVar48._4_4_;
              fVar103 = auVar48._8_4_;
              fVar104 = auVar48._12_4_;
              fVar105 = auVar48._16_4_;
              fVar106 = auVar48._20_4_;
              fVar107 = auVar48._24_4_;
              uVar22 = 0;
              if (1 < max_kk) {
                iVar9 = 1;
                do {
                  auVar66._0_4_ = fVar99 * *pfVar20;
                  auVar66._4_4_ = fVar102 * pfVar20[1];
                  auVar66._8_4_ = fVar103 * pfVar20[2];
                  auVar66._12_4_ = fVar104 * pfVar20[3];
                  auVar66._16_4_ = fVar105 * pfVar20[4];
                  auVar66._20_4_ = fVar106 * pfVar20[5];
                  auVar66._28_36_ = in_ZMM9._28_36_;
                  auVar66._24_4_ = fVar107 * pfVar20[6];
                  pfVar1 = pfVar20 + lVar18;
                  auVar84._0_4_ = fVar99 * *pfVar1;
                  auVar84._4_4_ = fVar102 * pfVar1[1];
                  auVar84._8_4_ = fVar103 * pfVar1[2];
                  auVar84._12_4_ = fVar104 * pfVar1[3];
                  auVar84._16_4_ = fVar105 * pfVar1[4];
                  auVar84._20_4_ = fVar106 * pfVar1[5];
                  auVar84._28_36_ = in_ZMM10._28_36_;
                  auVar84._24_4_ = fVar107 * pfVar1[6];
                  auVar48 = vpternlogd_avx512vl(auVar58,auVar66._0_32_,auVar49,0xf8);
                  auVar50 = vpternlogd_avx512vl(auVar58,auVar84._0_32_,auVar49,0xf8);
                  auVar110._0_4_ = (int)(auVar66._0_4_ + auVar48._0_4_);
                  auVar110._4_4_ = (int)(auVar66._4_4_ + auVar48._4_4_);
                  auVar110._8_4_ = (int)(auVar66._8_4_ + auVar48._8_4_);
                  auVar110._12_4_ = (int)(auVar66._12_4_ + auVar48._12_4_);
                  auVar110._16_4_ = (int)(auVar66._16_4_ + auVar48._16_4_);
                  auVar110._20_4_ = (int)(auVar66._20_4_ + auVar48._20_4_);
                  auVar110._24_4_ = (int)(auVar66._24_4_ + auVar48._24_4_);
                  auVar110._28_4_ = (int)(in_ZMM9._28_4_ + auVar48._28_4_);
                  auVar115._0_4_ = (int)(auVar84._0_4_ + auVar50._0_4_);
                  auVar115._4_4_ = (int)(auVar84._4_4_ + auVar50._4_4_);
                  auVar115._8_4_ = (int)(auVar84._8_4_ + auVar50._8_4_);
                  auVar115._12_4_ = (int)(auVar84._12_4_ + auVar50._12_4_);
                  auVar115._16_4_ = (int)(auVar84._16_4_ + auVar50._16_4_);
                  auVar115._20_4_ = (int)(auVar84._20_4_ + auVar50._20_4_);
                  auVar115._24_4_ = (int)(auVar84._24_4_ + auVar50._24_4_);
                  auVar115._28_4_ = (int)(in_ZMM10._28_4_ + auVar50._28_4_);
                  auVar48 = vpackssdw_avx2(auVar110,auVar115);
                  auVar48 = vpermq_avx2(auVar48,0xd8);
                  auVar48 = vpminsw_avx2(auVar48,auVar59);
                  auVar48 = vpmaxsw_avx2(auVar48,auVar60);
                  in_ZMM10 = ZEXT1664(auVar48._16_16_);
                  auVar31 = vpacksswb_avx(auVar48._0_16_,auVar48._16_16_);
                  auVar31 = vpshufb_avx(auVar31,auVar47);
                  in_ZMM9 = ZEXT1664(auVar31);
                  *(undefined1 (*) [16])*pauVar13 = auVar31;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                  pfVar20 = pfVar20 + iVar4 * 2;
                  iVar9 = iVar9 + 2;
                  uVar22 = local_48;
                } while (iVar9 < max_kk);
              }
              iVar9 = max_kk - uVar22;
              if (iVar9 != 0 && (int)uVar22 <= max_kk) {
                do {
                  auVar72._0_4_ = fVar99 * *pfVar20;
                  auVar72._4_4_ = fVar102 * pfVar20[1];
                  auVar72._8_4_ = fVar103 * pfVar20[2];
                  auVar72._12_4_ = fVar104 * pfVar20[3];
                  auVar72._16_4_ = fVar105 * pfVar20[4];
                  auVar72._20_4_ = fVar106 * pfVar20[5];
                  auVar72._28_36_ = in_ZMM9._28_36_;
                  auVar72._24_4_ = fVar107 * pfVar20[6];
                  auVar48 = vpternlogd_avx512vl(auVar58,auVar72._0_32_,auVar49,0xf8);
                  in_ZMM10 = ZEXT3264(auVar48);
                  auVar111._0_4_ = (int)(auVar72._0_4_ + auVar48._0_4_);
                  auVar111._4_4_ = (int)(auVar72._4_4_ + auVar48._4_4_);
                  auVar111._8_4_ = (int)(auVar72._8_4_ + auVar48._8_4_);
                  auVar111._12_4_ = (int)(auVar72._12_4_ + auVar48._12_4_);
                  auVar111._16_4_ = (int)(auVar72._16_4_ + auVar48._16_4_);
                  auVar111._20_4_ = (int)(auVar72._20_4_ + auVar48._20_4_);
                  auVar111._24_4_ = (int)(auVar72._24_4_ + auVar48._24_4_);
                  auVar111._28_4_ = (int)(in_ZMM9._28_4_ + auVar48._28_4_);
                  auVar31 = vpmovsdb_avx512vl(auVar111);
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = auVar31._0_8_;
                  auVar31 = vpmaxsb_avx(auVar32,auVar30);
                  in_ZMM9 = ZEXT1664(auVar31);
                  *(long *)*pauVar13 = auVar31._0_8_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                  pfVar20 = pfVar20 + lVar18;
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
            }
          }
          uVar12 = uVar25 + 8;
          lVar23 = uVar25 + 0xf;
          lVar19 = lVar19 + lVar28 * 0x20;
          uVar25 = uVar12;
        } while (lVar23 < max_ii);
      }
      auVar47 = _DAT_005b25c0;
      if ((int)((uint)uVar12 | 3) < max_ii) {
        local_60 = max_kk & 0xfffffffe;
        lVar19 = (long)(iVar4 * k) * 4 + (lVar29 + (uVar12 & 0xffffffff)) * lVar28 * 4;
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar31[8] = 0x81;
        auVar31._0_8_ = 0x8181818181818181;
        auVar31[9] = 0x81;
        auVar31[10] = 0x81;
        auVar31[0xb] = 0x81;
        auVar31[0xc] = 0x81;
        auVar31[0xd] = 0x81;
        auVar31[0xe] = 0x81;
        auVar31[0xf] = 0x81;
        auVar87._8_4_ = 0x80000000;
        auVar87._0_8_ = 0x8000000080000000;
        auVar87._12_4_ = 0x80000000;
        auVar87._16_4_ = 0x80000000;
        auVar87._20_4_ = 0x80000000;
        auVar87._24_4_ = 0x80000000;
        auVar87._28_4_ = 0x80000000;
        auVar89._8_4_ = 0x3f000000;
        auVar89._0_8_ = 0x3f0000003f000000;
        auVar89._12_4_ = 0x3f000000;
        auVar89._16_4_ = 0x3f000000;
        auVar89._20_4_ = 0x3f000000;
        auVar89._24_4_ = 0x3f000000;
        auVar89._28_4_ = 0x3f000000;
        auVar92._8_2_ = 0x7f;
        auVar92._0_8_ = 0x7f007f007f007f;
        auVar92._10_2_ = 0x7f;
        auVar92._12_2_ = 0x7f;
        auVar92._14_2_ = 0x7f;
        auVar92._16_2_ = 0x7f;
        auVar92._18_2_ = 0x7f;
        auVar92._20_2_ = 0x7f;
        auVar92._22_2_ = 0x7f;
        auVar92._24_2_ = 0x7f;
        auVar92._26_2_ = 0x7f;
        auVar92._28_2_ = 0x7f;
        auVar92._30_2_ = 0x7f;
        auVar96._8_2_ = 0xff81;
        auVar96._0_8_ = 0xff81ff81ff81ff81;
        auVar96._10_2_ = 0xff81;
        auVar96._12_2_ = 0xff81;
        auVar96._14_2_ = 0xff81;
        auVar96._16_2_ = 0xff81;
        auVar96._18_2_ = 0xff81;
        auVar96._20_2_ = 0xff81;
        auVar96._22_2_ = 0xff81;
        auVar96._24_2_ = 0xff81;
        auVar96._26_2_ = 0xff81;
        auVar96._28_2_ = 0xff81;
        auVar96._30_2_ = 0xff81;
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar34._8_4_ = 0x3f000000;
        auVar34._0_8_ = 0x3f0000003f000000;
        auVar34._12_4_ = 0x3f000000;
        auVar35._8_2_ = 0x7f;
        auVar35._0_8_ = 0x7f007f007f007f;
        auVar35._10_2_ = 0x7f;
        auVar35._12_2_ = 0x7f;
        auVar35._14_2_ = 0x7f;
        auVar36._8_2_ = 0xff81;
        auVar36._0_8_ = 0xff81ff81ff81ff81;
        auVar36._10_2_ = 0xff81;
        auVar36._12_2_ = 0xff81;
        auVar36._14_2_ = 0xff81;
        uVar25 = uVar12 & 0xffffffff;
        do {
          lVar23 = uVar25 + lVar29;
          if (iVar8 == 0x10) {
            if (0xf < max_kk) {
              pvVar5 = scales->data;
              auVar63 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4)));
              in_ZMM13 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 4)));
              in_ZMM14 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 8)));
              auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar5 + lVar23 * 4 + 0xc)));
              iVar9 = 0xf;
              pauVar24 = (undefined1 (*) [64])((long)A->data + lVar19);
              do {
                pauVar21 = pauVar24;
                auVar65 = vmulps_avx512f(auVar63,*pauVar21);
                auVar66 = vmulps_avx512f(in_ZMM13,pauVar21[1]);
                auVar84 = vmulps_avx512f(in_ZMM14,pauVar21[2]);
                auVar72 = vmulps_avx512f(auVar64,pauVar21[3]);
                auVar73 = vmovdqa64_avx512f(auVar62);
                auVar73 = vpternlogd_avx512f(auVar73,auVar65,auVar61,0xf8);
                auVar65 = vaddps_avx512f(auVar65,auVar73);
                auVar65 = vcvttps2dq_avx512f(auVar65);
                auVar30 = vpmovsdb_avx512f(auVar65);
                auVar30 = vpmaxsb_avx512vl(auVar30,auVar31);
                auVar65 = vmovdqa64_avx512f(auVar62);
                auVar65 = vpternlogd_avx512f(auVar65,auVar66,auVar61,0xf8);
                auVar65 = vaddps_avx512f(auVar66,auVar65);
                auVar65 = vcvttps2dq_avx512f(auVar65);
                auVar32 = vpmovsdb_avx512f(auVar65);
                auVar32 = vpmaxsb_avx512vl(auVar32,auVar31);
                auVar65 = vmovdqa64_avx512f(auVar62);
                auVar65 = vpternlogd_avx512f(auVar65,auVar84,auVar61,0xf8);
                auVar65 = vaddps_avx512f(auVar84,auVar65);
                auVar65 = vcvttps2dq_avx512f(auVar65);
                auVar37 = vpmovsdb_avx512f(auVar65);
                auVar37 = vpmaxsb_avx512vl(auVar37,auVar31);
                auVar65 = vmovdqa64_avx512f(auVar62);
                auVar65 = vpternlogd_avx512f(auVar65,auVar72,auVar61,0xf8);
                auVar65 = vaddps_avx512f(auVar72,auVar65);
                auVar65 = vcvttps2dq_avx512f(auVar65);
                auVar39 = vpmovsdb_avx512f(auVar65);
                auVar39 = vpmaxsb_avx512vl(auVar39,auVar31);
                auVar40 = vpunpcklwd_avx512vl(auVar30,auVar32);
                auVar30 = vpunpckhwd_avx512vl(auVar30,auVar32);
                auVar32 = vpunpcklwd_avx512vl(auVar37,auVar39);
                auVar37 = vpunpckhwd_avx512vl(auVar37,auVar39);
                auVar39 = vpunpckldq_avx512vl(auVar40,auVar32);
                auVar32 = vpunpckhdq_avx512vl(auVar40,auVar32);
                auVar40 = vpunpckldq_avx512vl(auVar30,auVar37);
                auVar37 = vpunpckhdq_avx512vl(auVar30,auVar37);
                auVar30 = vmovdqa64_avx512vl(auVar39);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                auVar30 = vmovdqa64_avx512vl(auVar32);
                *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar30;
                auVar30 = vmovdqa64_avx512vl(auVar40);
                *(undefined1 (*) [16])(*pauVar13 + 0x20) = auVar30;
                auVar30 = vmovdqa64_avx512vl(auVar37);
                *(undefined1 (*) [16])(*pauVar13 + 0x30) = auVar30;
                pauVar13 = pauVar13 + 1;
                iVar9 = iVar9 + 0x10;
                pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
              } while (iVar9 < max_kk);
              pauVar26 = (undefined1 (*) [32])(*pauVar21 + (long)(iVar4 << 4) * 4);
              goto LAB_004b12d4;
            }
          }
          else {
            pauVar26 = (undefined1 (*) [32])
                       ((long)A->data + lVar23 * lVar28 * 4 + (long)(iVar4 * k) * 4);
LAB_004b12d4:
            if (iVar8 == 8) {
              if (max_kk < 8) goto LAB_004b160f;
              pvVar5 = scales->data;
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4);
              auVar123._4_4_ = uVar3;
              auVar123._0_4_ = uVar3;
              auVar123._8_4_ = uVar3;
              auVar123._12_4_ = uVar3;
              auVar123._16_4_ = uVar3;
              auVar123._20_4_ = uVar3;
              auVar123._24_4_ = uVar3;
              auVar123._28_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 4);
              auVar132._4_4_ = uVar3;
              auVar132._0_4_ = uVar3;
              auVar132._8_4_ = uVar3;
              auVar132._12_4_ = uVar3;
              auVar132._16_4_ = uVar3;
              auVar132._20_4_ = uVar3;
              auVar132._24_4_ = uVar3;
              auVar132._28_4_ = uVar3;
              in_ZMM13 = ZEXT3264(auVar132);
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 8);
              auVar138._4_4_ = uVar3;
              auVar138._0_4_ = uVar3;
              auVar138._8_4_ = uVar3;
              auVar138._12_4_ = uVar3;
              auVar138._16_4_ = uVar3;
              auVar138._20_4_ = uVar3;
              auVar138._24_4_ = uVar3;
              auVar138._28_4_ = uVar3;
              in_ZMM14 = ZEXT3264(auVar138);
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 0xc);
              auVar143._4_4_ = uVar3;
              auVar143._0_4_ = uVar3;
              auVar143._8_4_ = uVar3;
              auVar143._12_4_ = uVar3;
              auVar143._16_4_ = uVar3;
              auVar143._20_4_ = uVar3;
              auVar143._24_4_ = uVar3;
              auVar143._28_4_ = uVar3;
              iVar9 = 7;
              do {
                auVar48 = vmulps_avx512vl(auVar123,*pauVar26);
                auVar49 = vmulps_avx512vl(auVar132,pauVar26[1]);
                auVar50 = vmulps_avx512vl(auVar138,pauVar26[2]);
                auVar58 = vmulps_avx512vl(auVar143,pauVar26[3]);
                auVar59 = vmovdqa64_avx512vl(auVar89);
                auVar59 = vpternlogd_avx512vl(auVar59,auVar48,auVar87,0xf8);
                auVar60 = vmovdqa64_avx512vl(auVar89);
                auVar60 = vpternlogd_avx512vl(auVar60,auVar50,auVar87,0xf8);
                auVar48 = vaddps_avx512vl(auVar48,auVar59);
                auVar50 = vaddps_avx512vl(auVar50,auVar60);
                auVar48 = vcvttps2dq_avx512vl(auVar48);
                auVar50 = vcvttps2dq_avx512vl(auVar50);
                auVar48 = vpackssdw_avx512vl(auVar48,auVar50);
                auVar48 = vpermq_avx512vl(auVar48,0xd8);
                auVar48 = vpminsw_avx512vl(auVar48,auVar92);
                auVar48 = vpmaxsw_avx512vl(auVar48,auVar96);
                auVar30 = vextracti32x4_avx512vl(auVar48,1);
                auVar30 = vpacksswb_avx512vl(auVar48._0_16_,auVar30);
                auVar48 = vmovdqa64_avx512vl(auVar89);
                auVar48 = vpternlogd_avx512vl(auVar48,auVar49,auVar87,0xf8);
                auVar50 = vmovdqa64_avx512vl(auVar89);
                auVar50 = vpternlogd_avx512vl(auVar50,auVar58,auVar87,0xf8);
                auVar48 = vaddps_avx512vl(auVar49,auVar48);
                auVar49 = vaddps_avx512vl(auVar58,auVar50);
                auVar48 = vcvttps2dq_avx512vl(auVar48);
                auVar49 = vcvttps2dq_avx512vl(auVar49);
                auVar48 = vpackssdw_avx512vl(auVar48,auVar49);
                auVar48 = vpermq_avx512vl(auVar48,0xd8);
                auVar48 = vpminsw_avx512vl(auVar48,auVar92);
                auVar48 = vpmaxsw_avx512vl(auVar48,auVar96);
                auVar32 = vextracti32x4_avx512vl(auVar48,1);
                auVar32 = vpacksswb_avx512vl(auVar48._0_16_,auVar32);
                auVar37 = vpunpcklwd_avx512vl(auVar30,auVar32);
                auVar30 = vpunpckhwd_avx512vl(auVar30,auVar32);
                auVar32 = vpunpckldq_avx512vl(auVar37,auVar30);
                auVar37 = vpunpckhdq_avx512vl(auVar37,auVar30);
                auVar30 = vmovdqa64_avx512vl(auVar32);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                auVar30 = vmovdqa64_avx512vl(auVar37);
                *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar30;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
                pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar4 * 8) * 4);
                iVar9 = iVar9 + 8;
              } while (iVar9 < max_kk);
            }
            if (iVar8 == 4) {
              if (max_kk < 4) goto LAB_004b160f;
              pvVar5 = scales->data;
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4);
              auVar37._4_4_ = uVar3;
              auVar37._0_4_ = uVar3;
              auVar37._8_4_ = uVar3;
              auVar37._12_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 4);
              auVar39._4_4_ = uVar3;
              auVar39._0_4_ = uVar3;
              auVar39._8_4_ = uVar3;
              auVar39._12_4_ = uVar3;
              in_ZMM13 = ZEXT1664(auVar39);
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 8);
              auVar40._4_4_ = uVar3;
              auVar40._0_4_ = uVar3;
              auVar40._8_4_ = uVar3;
              auVar40._12_4_ = uVar3;
              in_ZMM14 = ZEXT1664(auVar40);
              uVar3 = *(undefined4 *)((long)pvVar5 + lVar23 * 4 + 0xc);
              auVar38._4_4_ = uVar3;
              auVar38._0_4_ = uVar3;
              auVar38._8_4_ = uVar3;
              auVar38._12_4_ = uVar3;
              iVar9 = 3;
              do {
                auVar30 = vmulps_avx512vl(auVar37,*(undefined1 (*) [16])*pauVar26);
                auVar32 = vmulps_avx512vl(auVar39,*(undefined1 (*) [16])(*pauVar26 + 0x10));
                auVar41 = vmulps_avx512vl(auVar40,*(undefined1 (*) [16])pauVar26[1]);
                auVar42 = vmulps_avx512vl(auVar38,*(undefined1 (*) [16])(pauVar26[1] + 0x10));
                auVar43 = vmovdqa64_avx512vl(auVar34);
                auVar43 = vpternlogd_avx512vl(auVar43,auVar30,auVar33,0xf8);
                auVar44 = vmovdqa64_avx512vl(auVar34);
                auVar44 = vpternlogd_avx512vl(auVar44,auVar32,auVar33,0xf8);
                auVar45 = vmovdqa64_avx512vl(auVar34);
                auVar45 = vpternlogd_avx512vl(auVar45,auVar41,auVar33,0xf8);
                auVar46 = vmovdqa64_avx512vl(auVar34);
                auVar46 = vpternlogd_avx512vl(auVar46,auVar42,auVar33,0xf8);
                auVar30 = vaddps_avx512vl(auVar30,auVar43);
                auVar32 = vaddps_avx512vl(auVar32,auVar44);
                auVar41 = vaddps_avx512vl(auVar41,auVar45);
                auVar42 = vaddps_avx512vl(auVar42,auVar46);
                auVar30 = vcvttps2dq_avx512vl(auVar30);
                auVar32 = vcvttps2dq_avx512vl(auVar32);
                auVar30 = vpackssdw_avx512vl(auVar30,auVar32);
                auVar32 = vcvttps2dq_avx512vl(auVar41);
                auVar41 = vcvttps2dq_avx512vl(auVar42);
                auVar32 = vpackssdw_avx512vl(auVar32,auVar41);
                auVar30 = vpminsw_avx512vl(auVar30,auVar35);
                auVar32 = vpminsw_avx512vl(auVar32,auVar35);
                auVar30 = vpmaxsw_avx512vl(auVar30,auVar36);
                auVar32 = vpmaxsw_avx512vl(auVar32,auVar36);
                auVar30 = vpacksswb_avx512vl(auVar30,auVar32);
                auVar30 = vpshufb_avx512vl(auVar30,auVar47);
                auVar30 = vmovdqa64_avx512vl(auVar30);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar4 * 4) * 4);
                iVar9 = iVar9 + 4;
              } while (iVar9 < max_kk);
            }
            if (iVar8 == 1) {
              auVar30 = *(undefined1 (*) [16])((long)scales->data + uVar25 * 4 + lVar29 * 4);
              fVar102 = auVar30._4_4_;
              fVar103 = auVar30._8_4_;
              fVar104 = auVar30._12_4_;
              fVar99 = auVar30._0_4_;
              uVar22 = 0;
              if (1 < max_kk) {
                iVar9 = 1;
                do {
                  auVar41._0_4_ = fVar99 * *(float *)*pauVar26;
                  auVar41._4_4_ = fVar102 * *(float *)(*pauVar26 + 4);
                  auVar41._8_4_ = fVar103 * *(float *)(*pauVar26 + 8);
                  auVar41._12_4_ = fVar104 * *(float *)(*pauVar26 + 0xc);
                  pfVar20 = (float *)(*pauVar26 + lVar18 * 4);
                  auVar43._0_4_ = fVar99 * *pfVar20;
                  auVar43._4_4_ = fVar102 * pfVar20[1];
                  auVar43._8_4_ = fVar103 * pfVar20[2];
                  auVar43._12_4_ = fVar104 * pfVar20[3];
                  auVar32 = vunpcklps_avx(auVar41,auVar43);
                  auVar30 = vunpckhps_avx(auVar41,auVar43);
                  auVar37 = vpternlogd_avx512vl(auVar34,auVar32,auVar33,0xf8);
                  auVar39 = vmovdqa64_avx512vl(auVar34);
                  auVar39 = vpternlogd_avx512vl(auVar39,auVar30,auVar33,0xf8);
                  auVar30 = vaddps_avx512vl(auVar30,auVar39);
                  auVar44._0_4_ = (int)(auVar32._0_4_ + auVar37._0_4_);
                  auVar44._4_4_ = (int)(auVar32._4_4_ + auVar37._4_4_);
                  auVar44._8_4_ = (int)(auVar32._8_4_ + auVar37._8_4_);
                  auVar44._12_4_ = (int)(auVar32._12_4_ + auVar37._12_4_);
                  in_ZMM14 = ZEXT1664(auVar44);
                  auVar42._0_4_ = (int)auVar30._0_4_;
                  auVar42._4_4_ = (int)auVar30._4_4_;
                  auVar42._8_4_ = (int)auVar30._8_4_;
                  auVar42._12_4_ = (int)auVar30._12_4_;
                  auVar30 = vpackssdw_avx(auVar44,auVar42);
                  auVar30 = vpminsw_avx(auVar30,auVar35);
                  auVar30 = vpmaxsw_avx(auVar30,auVar36);
                  auVar30 = vpacksswb_avx(auVar30,auVar30);
                  in_ZMM13 = ZEXT1664(auVar30);
                  *(long *)*pauVar13 = auVar30._0_8_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar4 * 2) * 4);
                  iVar9 = iVar9 + 2;
                  uVar22 = local_60;
                } while (iVar9 < max_kk);
              }
              iVar9 = max_kk - uVar22;
              if (iVar9 != 0 && (int)uVar22 <= max_kk) {
                do {
                  auVar45._0_4_ = fVar99 * *(float *)*pauVar26;
                  auVar45._4_4_ = fVar102 * *(float *)(*pauVar26 + 4);
                  auVar45._8_4_ = fVar103 * *(float *)(*pauVar26 + 8);
                  auVar45._12_4_ = fVar104 * *(float *)(*pauVar26 + 0xc);
                  auVar30 = vpternlogd_avx512vl(auVar34,auVar45,auVar33,0xf8);
                  in_ZMM14 = ZEXT1664(auVar30);
                  auVar46._0_4_ = (int)(auVar45._0_4_ + auVar30._0_4_);
                  auVar46._4_4_ = (int)(auVar45._4_4_ + auVar30._4_4_);
                  auVar46._8_4_ = (int)(auVar45._8_4_ + auVar30._8_4_);
                  auVar46._12_4_ = (int)(auVar45._12_4_ + auVar30._12_4_);
                  auVar30 = vpackssdw_avx(auVar46,auVar46);
                  auVar30 = vpminsw_avx(auVar30,auVar35);
                  auVar30 = vpmaxsw_avx(auVar30,auVar36);
                  auVar30 = vpacksswb_avx(auVar30,auVar30);
                  in_ZMM13 = ZEXT1664(auVar30);
                  *(int *)*pauVar13 = auVar30._0_4_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar18 * 4);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
            }
          }
LAB_004b160f:
          uVar12 = uVar25 + 4;
          lVar23 = uVar25 + 7;
          lVar19 = lVar19 + lVar28 * 0x10;
          uVar25 = uVar12;
        } while (lVar23 < max_ii);
      }
      auVar47 = _DAT_005a5ac0;
      uVar22 = (uint)uVar12;
      if ((int)(uVar22 | 1) < max_ii) {
        lVar28 = (long)(iVar4 * k) * 4 + (lVar29 + (int)uVar22) * lVar28 * 4;
        lVar29 = (long)(iVar4 * 4) * 4;
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar85[8] = 0x81;
        auVar85._0_8_ = 0x8181818181818181;
        auVar85[9] = 0x81;
        auVar85[10] = 0x81;
        auVar85[0xb] = 0x81;
        auVar85[0xc] = 0x81;
        auVar85[0xd] = 0x81;
        auVar85[0xe] = 0x81;
        auVar85[0xf] = 0x81;
        auVar88._8_4_ = 0x80000000;
        auVar88._0_8_ = 0x8000000080000000;
        auVar88._12_4_ = 0x80000000;
        auVar88._16_4_ = 0x80000000;
        auVar88._20_4_ = 0x80000000;
        auVar88._24_4_ = 0x80000000;
        auVar88._28_4_ = 0x80000000;
        auVar90._8_4_ = 0x3f000000;
        auVar90._0_8_ = 0x3f0000003f000000;
        auVar90._12_4_ = 0x3f000000;
        auVar90._16_4_ = 0x3f000000;
        auVar90._20_4_ = 0x3f000000;
        auVar90._24_4_ = 0x3f000000;
        auVar90._28_4_ = 0x3f000000;
        auVar93._8_2_ = 0x7f;
        auVar93._0_8_ = 0x7f007f007f007f;
        auVar93._10_2_ = 0x7f;
        auVar93._12_2_ = 0x7f;
        auVar93._14_2_ = 0x7f;
        auVar93._16_2_ = 0x7f;
        auVar93._18_2_ = 0x7f;
        auVar93._20_2_ = 0x7f;
        auVar93._22_2_ = 0x7f;
        auVar93._24_2_ = 0x7f;
        auVar93._26_2_ = 0x7f;
        auVar93._28_2_ = 0x7f;
        auVar93._30_2_ = 0x7f;
        auVar97._8_2_ = 0xff81;
        auVar97._0_8_ = 0xff81ff81ff81ff81;
        auVar97._10_2_ = 0xff81;
        auVar97._12_2_ = 0xff81;
        auVar97._14_2_ = 0xff81;
        auVar97._16_2_ = 0xff81;
        auVar97._18_2_ = 0xff81;
        auVar97._20_2_ = 0xff81;
        auVar97._22_2_ = 0xff81;
        auVar97._24_2_ = 0xff81;
        auVar97._26_2_ = 0xff81;
        auVar97._28_2_ = 0xff81;
        auVar97._30_2_ = 0xff81;
        auVar100._8_4_ = 0x80000000;
        auVar100._0_8_ = 0x8000000080000000;
        auVar100._12_4_ = 0x80000000;
        auVar108._8_4_ = 0x3f000000;
        auVar108._0_8_ = 0x3f0000003f000000;
        auVar108._12_4_ = 0x3f000000;
        auVar112._8_2_ = 0x7f;
        auVar112._0_8_ = 0x7f007f007f007f;
        auVar112._10_2_ = 0x7f;
        auVar112._12_2_ = 0x7f;
        auVar112._14_2_ = 0x7f;
        auVar116._8_2_ = 0xff81;
        auVar116._0_8_ = 0xff81ff81ff81ff81;
        auVar116._10_2_ = 0xff81;
        auVar116._12_2_ = 0xff81;
        auVar116._14_2_ = 0xff81;
        auVar120._8_4_ = 0x80000000;
        auVar120._0_8_ = 0x8000000080000000;
        auVar120._12_4_ = 0x80000000;
        auVar124._8_4_ = 0x3effffff;
        auVar124._0_8_ = 0x3effffff3effffff;
        auVar124._12_4_ = 0x3effffff;
        in_ZMM13 = ZEXT1664(auVar124);
        uVar25 = (long)(int)uVar22;
        do {
          lVar23 = *(long *)(puVar16 + 0x18) + uVar25;
          lVar19 = *(long *)(puVar16 + 0x10);
          if ((int)lVar19 == 0x10) {
            if (0xf < max_kk) {
              in_ZMM14 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)scales->data + lVar23 * 4)));
              auVar63 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)scales->data + lVar23 * 4 + 4)));
              iVar8 = 0xf;
              pauVar24 = (undefined1 (*) [64])(**(long **)(puVar16 + 0x20) + lVar28);
              do {
                pauVar21 = pauVar24;
                auVar64 = vmulps_avx512f(in_ZMM14,*pauVar21);
                auVar65 = vmulps_avx512f(auVar63,pauVar21[1]);
                auVar66 = vmovdqa64_avx512f(auVar62);
                auVar66 = vpternlogd_avx512f(auVar66,auVar64,auVar61,0xf8);
                auVar64 = vaddps_avx512f(auVar64,auVar66);
                auVar64 = vcvttps2dq_avx512f(auVar64);
                auVar30 = vpmovsdb_avx512f(auVar64);
                auVar30 = vpmaxsb_avx512vl(auVar30,auVar85);
                auVar64 = vmovdqa64_avx512f(auVar62);
                auVar64 = vpternlogd_avx512f(auVar64,auVar65,auVar61,0xf8);
                auVar64 = vaddps_avx512f(auVar65,auVar64);
                auVar64 = vcvttps2dq_avx512f(auVar64);
                auVar31 = vpmovsdb_avx512f(auVar64);
                auVar31 = vpmaxsb_avx512vl(auVar31,auVar85);
                auVar32 = vpunpcklwd_avx512vl(auVar30,auVar31);
                auVar31 = vpunpckhwd_avx512vl(auVar30,auVar31);
                auVar30 = vmovdqa64_avx512vl(auVar32);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                auVar30 = vmovdqa64_avx512vl(auVar31);
                *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar30;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
                iVar8 = iVar8 + 0x10;
                pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
              } while (iVar8 < max_kk);
              pauVar26 = (undefined1 (*) [32])(*pauVar21 + *(long *)(puVar16 + 0x38) * 4);
              lVar19 = *(long *)(puVar16 + 0x10);
              goto LAB_004b184e;
            }
          }
          else {
            pauVar26 = (undefined1 (*) [32])
                       (**(long **)(puVar16 + 0x20) + *(long *)(puVar16 + 0x40) * 4 +
                       lVar23 * lVar19 * 4);
LAB_004b184e:
            if ((int)lVar19 == 8) {
              if (max_kk < 8) goto LAB_004b1bb5;
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4);
              auVar139._4_4_ = uVar3;
              auVar139._0_4_ = uVar3;
              auVar139._8_4_ = uVar3;
              auVar139._12_4_ = uVar3;
              auVar139._16_4_ = uVar3;
              auVar139._20_4_ = uVar3;
              auVar139._24_4_ = uVar3;
              auVar139._28_4_ = uVar3;
              in_ZMM14 = ZEXT3264(auVar139);
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4 + 4);
              auVar144._4_4_ = uVar3;
              auVar144._0_4_ = uVar3;
              auVar144._8_4_ = uVar3;
              auVar144._12_4_ = uVar3;
              auVar144._16_4_ = uVar3;
              auVar144._20_4_ = uVar3;
              auVar144._24_4_ = uVar3;
              auVar144._28_4_ = uVar3;
              iVar8 = 7;
              do {
                auVar48 = vmulps_avx512vl(auVar139,*pauVar26);
                auVar49 = vmulps_avx512vl(auVar144,pauVar26[1]);
                auVar50 = vmovdqa64_avx512vl(auVar90);
                auVar50 = vpternlogd_avx512vl(auVar50,auVar48,auVar88,0xf8);
                auVar58 = vmovdqa64_avx512vl(auVar90);
                auVar58 = vpternlogd_avx512vl(auVar58,auVar49,auVar88,0xf8);
                auVar48 = vaddps_avx512vl(auVar48,auVar50);
                auVar49 = vaddps_avx512vl(auVar49,auVar58);
                auVar48 = vcvttps2dq_avx512vl(auVar48);
                auVar49 = vcvttps2dq_avx512vl(auVar49);
                auVar48 = vpackssdw_avx512vl(auVar48,auVar49);
                auVar48 = vpermq_avx512vl(auVar48,0xd8);
                auVar48 = vpminsw_avx512vl(auVar48,auVar93);
                auVar48 = vpmaxsw_avx512vl(auVar48,auVar97);
                auVar30 = vextracti32x4_avx512vl(auVar48,1);
                auVar30 = vpacksswb_avx512vl(auVar48._0_16_,auVar30);
                auVar30 = vpshufb_avx512vl(auVar30,auVar47);
                auVar30 = vmovdqa64_avx512vl(auVar30);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar4 * 8) * 4);
                iVar8 = iVar8 + 8;
              } while (iVar8 < max_kk);
            }
            if (*(int *)(puVar16 + 0x10) == 4) {
              if (max_kk < 4) goto LAB_004b1bb5;
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4);
              auVar134._4_4_ = uVar3;
              auVar134._0_4_ = uVar3;
              auVar134._8_4_ = uVar3;
              auVar134._12_4_ = uVar3;
              in_ZMM14 = ZEXT1664(auVar134);
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4 + 4);
              auVar140._4_4_ = uVar3;
              auVar140._0_4_ = uVar3;
              auVar140._8_4_ = uVar3;
              auVar140._12_4_ = uVar3;
              iVar8 = 3;
              do {
                auVar31 = vmulps_avx512vl(auVar134,*(undefined1 (*) [16])*pauVar26);
                auVar32 = vmulps_avx512vl(auVar140,*(undefined1 (*) [16])(*pauVar26 + 0x10));
                auVar30 = vmovlhps_avx512f(auVar31,auVar32);
                auVar31 = vunpckhpd_avx512vl(auVar31,auVar32);
                auVar32 = vmovdqa64_avx512vl(auVar108);
                auVar32 = vpternlogd_avx512vl(auVar32,auVar30,auVar100,0xf8);
                auVar33 = vmovdqa64_avx512vl(auVar108);
                auVar33 = vpternlogd_avx512vl(auVar33,auVar31,auVar100,0xf8);
                auVar30 = vaddps_avx512vl(auVar30,auVar32);
                auVar31 = vaddps_avx512vl(auVar31,auVar33);
                auVar30 = vcvttps2dq_avx512vl(auVar30);
                auVar31 = vcvttps2dq_avx512vl(auVar31);
                auVar30 = vpackssdw_avx512vl(auVar30,auVar31);
                auVar30 = vpminsw_avx512vl(auVar30,auVar112);
                auVar30 = vpmaxsw_avx512vl(auVar30,auVar116);
                auVar30 = vpacksswb_avx512vl(auVar30,auVar30);
                *(long *)*pauVar13 = auVar30._0_8_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar29);
                iVar8 = iVar8 + 4;
              } while (iVar8 < max_kk);
            }
            if (*(int *)(puVar16 + 0x10) == 1) {
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4);
              auVar135._4_4_ = uVar3;
              auVar135._0_4_ = uVar3;
              auVar135._8_4_ = uVar3;
              auVar135._12_4_ = uVar3;
              in_ZMM14 = ZEXT1664(auVar135);
              uVar22 = 0;
              uVar3 = *(undefined4 *)((long)scales->data + lVar23 * 4 + 4);
              auVar141._4_4_ = uVar3;
              auVar141._0_4_ = uVar3;
              auVar141._8_4_ = uVar3;
              auVar141._12_4_ = uVar3;
              if (3 < max_kk) {
                iVar8 = 3;
                lVar19 = *(long *)(puVar16 + 0x50);
                lVar23 = *(long *)(puVar16 + 0x48);
                do {
                  auVar145._8_8_ = 0;
                  auVar145._0_8_ = *(ulong *)*pauVar26;
                  auVar146._8_8_ = 0;
                  auVar146._0_8_ = *(ulong *)(*pauVar26 + lVar18 * 4);
                  auVar31 = vunpcklps_avx512vl(auVar145,auVar146);
                  auVar147._8_8_ = 0;
                  auVar147._0_8_ = *(ulong *)(*pauVar26 + lVar19 * 4);
                  auVar149._8_8_ = 0;
                  auVar149._0_8_ = *(ulong *)(*pauVar26 + lVar23 * 4);
                  auVar32 = vunpcklps_avx512vl(auVar147,auVar149);
                  auVar30 = vmovlhps_avx512f(auVar31,auVar32);
                  auVar31 = vunpckhpd_avx512vl(auVar31,auVar32);
                  auVar32 = vmulps_avx512vl(auVar135,auVar30);
                  auVar31 = vmulps_avx512vl(auVar141,auVar31);
                  auVar30 = vmovlhps_avx512f(auVar32,auVar31);
                  auVar31 = vunpckhpd_avx512vl(auVar32,auVar31);
                  auVar32 = vmovdqa64_avx512vl(auVar108);
                  auVar32 = vpternlogd_avx512vl(auVar32,auVar30,auVar100,0xf8);
                  auVar33 = vmovdqa64_avx512vl(auVar108);
                  auVar33 = vpternlogd_avx512vl(auVar33,auVar31,auVar100,0xf8);
                  auVar30 = vaddps_avx512vl(auVar30,auVar32);
                  auVar31 = vaddps_avx512vl(auVar31,auVar33);
                  auVar30 = vcvttps2dq_avx512vl(auVar30);
                  auVar31 = vcvttps2dq_avx512vl(auVar31);
                  auVar30 = vpackssdw_avx512vl(auVar30,auVar31);
                  auVar30 = vpminsw_avx512vl(auVar30,auVar112);
                  auVar30 = vpmaxsw_avx512vl(auVar30,auVar116);
                  auVar30 = vpacksswb_avx512vl(auVar30,auVar30);
                  *(long *)*pauVar13 = auVar30._0_8_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar29);
                  iVar8 = iVar8 + 4;
                } while (iVar8 < max_kk);
                uVar22 = *(uint *)(puVar16 + 0x68);
              }
              if ((int)(uVar22 | 1) < max_kk) {
                auVar30 = vmovlhps_avx512f(auVar135,auVar141);
                lVar19 = *(long *)(puVar16 + 0x60);
                uVar10 = uVar22;
                do {
                  auVar148._8_8_ = 0;
                  auVar148._0_8_ = *(ulong *)*pauVar26;
                  auVar150._8_8_ = 0;
                  auVar150._0_8_ = *(ulong *)(*pauVar26 + lVar18 * 4);
                  auVar31 = vunpcklps_avx512vl(auVar148,auVar150);
                  auVar31 = vmulps_avx512vl(auVar31,auVar30);
                  auVar32 = vmovdqa64_avx512vl(auVar108);
                  auVar32 = vpternlogd_avx512vl(auVar32,auVar31,auVar100,0xf8);
                  auVar31 = vaddps_avx512vl(auVar31,auVar32);
                  auVar31 = vcvttps2dq_avx512vl(auVar31);
                  auVar31 = vpackssdw_avx512vl(auVar31,auVar31);
                  auVar31 = vpminsw_avx512vl(auVar31,auVar112);
                  auVar31 = vpmaxsw_avx512vl(auVar31,auVar116);
                  auVar31 = vpacksswb_avx512vl(auVar31,auVar31);
                  *(int *)*pauVar13 = auVar31._0_4_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                  uVar22 = uVar10 + 2;
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar19);
                  iVar8 = uVar10 + 3;
                  uVar10 = uVar22;
                } while (iVar8 < max_kk);
              }
              uVar10 = max_kk - uVar22;
              if (uVar10 != 0 && (int)uVar22 <= max_kk) {
                puVar27 = (uint *)(*pauVar26 + 4);
                do {
                  uVar12 = (ulong)uVar10;
                  auVar30 = vmulss_avx512f(auVar135,ZEXT416(puVar27[-1]));
                  auVar31 = vmovdqa64_avx512vl(auVar124);
                  auVar31 = vpternlogd_avx512vl(auVar31,auVar30,auVar120,0xf8);
                  auVar30 = vaddss_avx512f(auVar30,auVar31);
                  vrndscaless_avx512f(auVar30,auVar30);
                  uVar15 = (uint)puVar16 | *(uint *)(uVar25 + 0x31);
                  if (((int)uVar15 < 1) ||
                     (uVar12 = (ulong)CONCAT31((int3)(uVar10 >> 8),(char)uVar10 + '\b'),
                     (int)uVar22 < -0x7e)) {
                    uVar22 = 0xffffff81;
                  }
                  iVar8 = (int)uVar12;
                  if (0x7e < (int)uVar22) {
                    uVar22 = 0x7f;
                  }
                  (*pauVar13)[0] = (char)uVar22;
                  auVar30 = vmulss_avx512f(auVar141,ZEXT416(*puVar27));
                  auVar31 = vmovdqa64_avx512vl(auVar124);
                  auVar31 = vpternlogd_avx512vl(auVar31,auVar30,auVar120,0xf8);
                  auVar30 = vaddss_avx512f(auVar30,auVar31);
                  vrndscaless_avx512f(auVar30,auVar30);
                  uVar15 = uVar15 | *(uint *)(uVar25 + 0x31);
                  puVar16 = (undefined1 *)(ulong)uVar15;
                  if (((int)uVar15 < 1) ||
                     (iVar8 = (int)CONCAT71((int7)(uVar12 >> 8),(char)uVar12 + '\b'),
                     (int)uVar22 < -0x7e)) {
                    uVar22 = 0xffffff81;
                  }
                  if (0x7e < (int)uVar22) {
                    uVar22 = 0x7f;
                  }
                  (*pauVar13)[1] = (char)uVar22;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 2);
                  puVar27 = puVar27 + lVar18;
                  uVar10 = iVar8 - 1;
                } while (uVar10 != 0);
              }
            }
          }
LAB_004b1bb5:
          uVar12 = uVar25 + 2;
          lVar19 = uVar25 + 3;
          lVar28 = lVar28 + *(long *)(puVar16 + 0x30);
          uVar25 = uVar12;
        } while (lVar19 < *(long *)(puVar16 + 0x58));
        lVar29 = *(long *)(puVar16 + 0x18);
        k = *(int *)(puVar16 + 0x2c);
        max_ii = *(int *)(puVar16 + 0x28);
        puVar17 = puVar16;
      }
      if ((int)uVar12 < max_ii) {
        auVar47 = vpbroadcastd_avx512vl();
        vpmulld_avx(auVar47,_DAT_005a5590);
        *(uint *)(puVar17 + 0x38) = max_kk & 0xfffffffc;
        lVar23 = (long)(int)uVar12;
        lVar19 = *(long *)(puVar17 + 0x10);
        *(long *)(puVar17 + 0x30) = (long)(k * iVar4);
        lVar28 = (long)(k * iVar4) * 4 + (lVar23 + lVar29) * lVar19 * 4;
        *(long *)(puVar17 + 0x40) = (long)(iVar4 << 4);
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar62 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar86[8] = 0x81;
        auVar86._0_8_ = 0x8181818181818181;
        auVar86[9] = 0x81;
        auVar86[10] = 0x81;
        auVar86[0xb] = 0x81;
        auVar86[0xc] = 0x81;
        auVar86[0xd] = 0x81;
        auVar86[0xe] = 0x81;
        auVar86[0xf] = 0x81;
        auVar91._8_4_ = 0x3f000000;
        auVar91._0_8_ = 0x3f0000003f000000;
        auVar91._12_4_ = 0x3f000000;
        auVar91._16_4_ = 0x3f000000;
        auVar91._20_4_ = 0x3f000000;
        auVar91._24_4_ = 0x3f000000;
        auVar91._28_4_ = 0x3f000000;
        auVar94._8_4_ = 0x80000000;
        auVar94._0_8_ = 0x8000000080000000;
        auVar94._12_4_ = 0x80000000;
        auVar94._16_4_ = 0x80000000;
        auVar94._20_4_ = 0x80000000;
        auVar94._24_4_ = 0x80000000;
        auVar94._28_4_ = 0x80000000;
        auVar95._8_4_ = 0x3f000000;
        auVar95._0_8_ = 0x3f0000003f000000;
        auVar95._12_4_ = 0x3f000000;
        auVar98._8_4_ = 0x80000000;
        auVar98._0_8_ = 0x8000000080000000;
        auVar98._12_4_ = 0x80000000;
        auVar101._8_2_ = 0x7f;
        auVar101._0_8_ = 0x7f007f007f007f;
        auVar101._10_2_ = 0x7f;
        auVar101._12_2_ = 0x7f;
        auVar101._14_2_ = 0x7f;
        auVar109._8_2_ = 0xff81;
        auVar109._0_8_ = 0xff81ff81ff81ff81;
        auVar109._10_2_ = 0xff81;
        auVar109._12_2_ = 0xff81;
        auVar109._14_2_ = 0xff81;
        auVar113._8_4_ = 0x3effffff;
        auVar113._0_8_ = 0x3effffff3effffff;
        auVar113._12_4_ = 0x3effffff;
        do {
          lVar2 = lVar23 + lVar29;
          fVar99 = *(float *)((long)scales->data + lVar2 * 4);
          lVar29 = *(long *)(puVar17 + 0x10);
          if ((int)lVar29 == 0x10) {
            if (0xf < max_kk) {
              auVar63 = vbroadcastss_avx512f(ZEXT416((uint)fVar99));
              iVar8 = 0xf;
              pauVar24 = (undefined1 (*) [64])(**(long **)(puVar17 + 0x20) + lVar28);
              do {
                pauVar21 = pauVar24;
                auVar64 = vmulps_avx512f(auVar63,*pauVar21);
                auVar65 = vmovdqa64_avx512f(auVar61);
                in_ZMM14 = vpternlogd_avx512f(auVar65,auVar64,auVar62,0xf8);
                auVar64 = vaddps_avx512f(auVar64,in_ZMM14);
                auVar64 = vcvttps2dq_avx512f(auVar64);
                auVar47 = vpmovsdb_avx512f(auVar64);
                auVar47 = vpmaxsb_avx(auVar47,auVar86);
                in_ZMM13 = ZEXT1664(auVar47);
                *(undefined1 (*) [16])*pauVar13 = auVar47;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                iVar8 = iVar8 + 0x10;
                pauVar24 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar4 << 4) * 4);
              } while (iVar8 < max_kk);
              pfVar20 = (float *)(*pauVar21 + *(long *)(puVar17 + 0x40) * 4);
              lVar29 = *(long *)(puVar17 + 0x10);
              goto LAB_004b1d60;
            }
LAB_004b1ee1:
            lVar29 = *(long *)(puVar17 + 0x18);
          }
          else {
            pfVar20 = (float *)(**(long **)(puVar17 + 0x20) + *(long *)(puVar17 + 0x30) * 4 +
                               lVar2 * lVar29 * 4);
LAB_004b1d60:
            if ((int)lVar29 == 8) {
              if (max_kk < 8) goto LAB_004b1ee1;
              fVar102 = *(float *)((long)scales->data + lVar2 * 4);
              iVar8 = 7;
              do {
                auVar73._0_4_ = fVar102 * *pfVar20;
                auVar73._4_4_ = fVar102 * pfVar20[1];
                auVar73._8_4_ = fVar102 * pfVar20[2];
                auVar73._12_4_ = fVar102 * pfVar20[3];
                auVar73._16_4_ = fVar102 * pfVar20[4];
                auVar73._20_4_ = fVar102 * pfVar20[5];
                auVar73._28_36_ = in_ZMM13._28_36_;
                auVar73._24_4_ = fVar102 * pfVar20[6];
                auVar48 = vpternlogd_avx512vl(auVar91,auVar73._0_32_,auVar94,0xf8);
                in_ZMM14 = ZEXT3264(auVar48);
                auVar133._0_4_ = (int)(auVar73._0_4_ + auVar48._0_4_);
                auVar133._4_4_ = (int)(auVar73._4_4_ + auVar48._4_4_);
                auVar133._8_4_ = (int)(auVar73._8_4_ + auVar48._8_4_);
                auVar133._12_4_ = (int)(auVar73._12_4_ + auVar48._12_4_);
                auVar133._16_4_ = (int)(auVar73._16_4_ + auVar48._16_4_);
                auVar133._20_4_ = (int)(auVar73._20_4_ + auVar48._20_4_);
                auVar133._24_4_ = (int)(auVar73._24_4_ + auVar48._24_4_);
                auVar133._28_4_ = (int)(in_ZMM13._28_4_ + auVar48._28_4_);
                auVar47 = vpmovsdb_avx512vl(auVar133);
                auVar125._8_8_ = 0;
                auVar125._0_8_ = auVar47._0_8_;
                auVar47 = vpmaxsb_avx(auVar125,auVar86);
                in_ZMM13 = ZEXT1664(auVar47);
                *(long *)*pauVar13 = auVar47._0_8_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                iVar8 = iVar8 + 8;
                pfVar20 = pfVar20 + iVar4 * 8;
              } while (iVar8 < max_kk);
            }
            if (*(int *)(puVar17 + 0x10) == 4) {
              if (max_kk < 4) goto LAB_004b1ee1;
              fVar102 = *(float *)((long)scales->data + lVar2 * 4);
              iVar8 = 3;
              do {
                auVar126._0_4_ = fVar102 * *pfVar20;
                auVar126._4_4_ = fVar102 * pfVar20[1];
                auVar126._8_4_ = fVar102 * pfVar20[2];
                auVar126._12_4_ = fVar102 * pfVar20[3];
                auVar47 = vpternlogd_avx512vl(auVar95,auVar126,auVar98,0xf8);
                in_ZMM14 = ZEXT1664(auVar47);
                auVar127._0_4_ = (int)(auVar126._0_4_ + auVar47._0_4_);
                auVar127._4_4_ = (int)(auVar126._4_4_ + auVar47._4_4_);
                auVar127._8_4_ = (int)(auVar126._8_4_ + auVar47._8_4_);
                auVar127._12_4_ = (int)(auVar126._12_4_ + auVar47._12_4_);
                auVar47 = vpackssdw_avx(auVar127,auVar127);
                auVar47 = vpminsw_avx(auVar47,auVar101);
                auVar47 = vpmaxsw_avx(auVar47,auVar109);
                auVar47 = vpacksswb_avx(auVar47,auVar47);
                in_ZMM13 = ZEXT1664(auVar47);
                *(int *)*pauVar13 = auVar47._0_4_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                iVar8 = iVar8 + 4;
                pfVar20 = pfVar20 + iVar4 * 4;
              } while (iVar8 < max_kk);
            }
            lVar29 = *(long *)(puVar17 + 0x18);
            if (*(int *)(puVar17 + 0x10) == 1) {
              iVar8 = 0;
              if (3 < max_kk) {
                fVar102 = *(float *)((long)scales->data + lVar2 * 4);
                iVar8 = 3;
                do {
                  auVar47 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
                  auVar47 = vgatherdps((undefined1  [16])0x0,auVar47);
                  auVar128._0_4_ = auVar47._0_4_ * fVar102;
                  auVar128._4_4_ = auVar47._4_4_ * fVar102;
                  auVar128._8_4_ = auVar47._8_4_ * fVar102;
                  auVar128._12_4_ = auVar47._12_4_ * fVar102;
                  auVar47 = vpternlogd_avx512vl(auVar95,auVar128,auVar98,0xf8);
                  in_ZMM14 = ZEXT1664(auVar47);
                  auVar129._0_4_ = (int)(auVar128._0_4_ + auVar47._0_4_);
                  auVar129._4_4_ = (int)(auVar128._4_4_ + auVar47._4_4_);
                  auVar129._8_4_ = (int)(auVar128._8_4_ + auVar47._8_4_);
                  auVar129._12_4_ = (int)(auVar128._12_4_ + auVar47._12_4_);
                  auVar47 = vpackssdw_avx(auVar129,auVar129);
                  auVar47 = vpminsw_avx(auVar47,auVar101);
                  auVar47 = vpmaxsw_avx(auVar47,auVar109);
                  auVar47 = vpacksswb_avx(auVar47,auVar47);
                  in_ZMM13 = ZEXT1664(auVar47);
                  *(int *)*pauVar13 = auVar47._0_4_;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                  iVar8 = iVar8 + 4;
                  pfVar20 = pfVar20 + iVar4 * 4;
                } while (iVar8 < max_kk);
                iVar8 = *(int *)(puVar17 + 0x38);
              }
              iVar9 = max_kk - iVar8;
              if (iVar9 != 0 && iVar8 <= max_kk) {
                do {
                  fVar102 = fVar99 * *pfVar20;
                  auVar47 = vpternlogd_avx512vl(auVar113,ZEXT416((uint)fVar102),auVar98,0xf8);
                  in_ZMM13 = ZEXT1664(auVar47);
                  auVar47 = ZEXT416((uint)(fVar102 + auVar47._0_4_));
                  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
                  iVar8 = (int)auVar47._0_4_;
                  if (iVar8 < -0x7e) {
                    iVar8 = -0x7f;
                  }
                  if (0x7e < iVar8) {
                    iVar8 = 0x7f;
                  }
                  (*pauVar13)[0] = (char)iVar8;
                  pauVar13 = (undefined1 (*) [64])(*pauVar13 + 1);
                  pfVar20 = pfVar20 + lVar18;
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
            }
          }
          lVar23 = lVar23 + 1;
          lVar28 = lVar28 + lVar19 * 4;
        } while (lVar23 != *(long *)(puVar17 + 0x58));
      }
    }
    else {
      transpose_pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
    }
  }
  else {
    transpose_pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    transpose_pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}